

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  stbtt__point sVar5;
  stbtt__point sVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  stbtt_uint8 sVar10;
  byte bVar11;
  ImWchar IVar12;
  short sVar13;
  ImFont *pIVar14;
  ImFont **ppIVar15;
  stbtt_uint8 *data;
  ImFontConfig *pIVar16;
  long lVar17;
  char cVar18;
  char cVar24;
  stbrp_node *psVar32;
  undefined1 auVar33 [16];
  stbtt__buf fontdict;
  undefined1 auVar34 [14];
  undefined1 auVar35 [12];
  unkuint10 Var36;
  undefined1 auVar37 [12];
  undefined1 auVar38 [16];
  unkbyte10 Var39;
  undefined1 auVar40 [13];
  undefined1 auVar41 [11];
  undefined1 auVar42 [14];
  undefined1 auVar43 [15];
  undefined1 auVar44 [14];
  undefined1 auVar45 [16];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  uint6 uVar51;
  ushort uVar52;
  short sVar53;
  stbtt_uint32 sVar54;
  uint uVar60;
  int iVar61;
  stbtt__active_edge *z;
  stbtt_uint32 sVar55;
  stbtt_uint32 sVar56;
  stbtt_uint32 sVar57;
  stbtt_uint32 sVar58;
  stbtt_uint32 sVar59;
  void *__dest;
  void *pvVar62;
  ulong uVar63;
  undefined4 extraout_var;
  int *piVar64;
  void *pvVar65;
  stbrp_context *ptr;
  uchar *puVar66;
  stbtt__point *points;
  stbtt__edge *psVar67;
  stbtt__buf *scanline;
  stbtt__active_edge *psVar68;
  stbtt__buf *psVar69;
  undefined8 *puVar70;
  int iVar71;
  long lVar72;
  ImWchar *pIVar73;
  ushort *puVar74;
  uint *puVar75;
  stbtt__active_edge *psVar76;
  stbtt__active_edge *psVar77;
  long lVar78;
  ulong uVar79;
  stbtt_fontinfo *psVar80;
  byte *pbVar81;
  ImU32 bit_n;
  uchar uVar82;
  int output_i;
  ulong uVar83;
  stbtt__edge *psVar84;
  ulong uVar85;
  size_t size;
  byte *pbVar86;
  ImFontConfig *pIVar87;
  int iVar88;
  int iVar89;
  long lVar90;
  undefined1 auVar91 [8];
  undefined8 *ptr_00;
  int iVar92;
  void *pvVar93;
  stbtt__active_edge *psVar94;
  uint uVar95;
  long lVar96;
  ImU32 mask;
  bool bVar97;
  bool bVar98;
  byte bVar99;
  float fVar100;
  byte bVar107;
  char cVar108;
  char cVar109;
  short sVar110;
  ushort uVar111;
  short sVar112;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar113;
  uint uVar121;
  undefined4 uVar122;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  uint uVar123;
  undefined1 auVar117 [16];
  uint uVar124;
  uint uVar126;
  uint uVar127;
  uint uVar128;
  undefined1 auVar125 [16];
  uint uVar129;
  uint uVar130;
  uint uVar131;
  undefined1 in_XMM3 [16];
  uint uVar132;
  uint uVar133;
  uint uVar135;
  uint uVar136;
  undefined1 auVar134 [16];
  uint uVar137;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar143;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar149;
  undefined4 uVar150;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar155 [16];
  float fVar160;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined4 uVar168;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  stbtt__buf sVar183;
  float y0_2;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  int y1;
  stbtt_uint32 charstrings;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<stbtt_packedchar> buf_packedchars;
  stbtt_uint32 fdarrayoff;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  stbtt__buf b;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb3c;
  int iVar184;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  int iVar185;
  stbtt_uint32 local_48c;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  ulong local_468;
  long local_460;
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined8 local_438;
  void *pvStack_430;
  undefined8 local_428;
  void *pvStack_420;
  stbrp_node *local_418;
  undefined8 local_410;
  int local_404;
  float local_400;
  uint local_3fc;
  void *local_3f8;
  ulong local_3f0;
  undefined1 local_3e8 [16];
  ulong local_3d8;
  float local_3d0;
  int local_3cc;
  ulong local_3c8;
  uchar *local_3c0;
  long local_3b8;
  stbtt__point *local_3b0;
  uchar *local_3a8;
  ulong local_3a0;
  ulong local_398;
  float *local_390;
  uint local_384;
  uint local_380;
  int local_37c;
  int local_378;
  float local_374;
  float local_370;
  int local_36c;
  int local_368;
  int local_364;
  stbrp_context *local_360;
  ulong local_358;
  stbtt_fontinfo *local_350;
  float *local_348;
  ulong local_340;
  ulong local_338;
  stbtt__edge *local_330;
  float local_328;
  undefined4 uStack_324;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  float local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  ImFontConfig *local_308;
  long local_300;
  long local_2f8;
  undefined4 *local_2f0;
  long local_2e8;
  long local_2e0;
  size_t local_2d8;
  size_t local_2d0;
  undefined8 *local_2c8;
  int local_2c0;
  int local_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  ulong local_298;
  undefined8 uStack_290;
  stbtt__buf local_288 [33];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined6 uVar151;
  undefined8 uVar152;
  undefined1 auVar153 [12];
  undefined1 auVar154 [14];
  undefined1 auVar156 [16];
  undefined6 uVar169;
  undefined8 uVar170;
  undefined1 auVar171 [12];
  undefined1 auVar172 [14];
  undefined1 auVar176 [16];
  
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  iVar92 = 0;
  pvVar62 = (void *)0x0;
  local_438 = 0;
  pvStack_430 = (void *)0x0;
  iVar185 = (atlas->ConfigData).Size;
  iVar61 = 0;
  __dest = pvVar62;
  if (0 < iVar185) {
    iVar184 = 8;
    if (7 < iVar185) {
      iVar184 = iVar185;
    }
    if ((0 < iVar184) &&
       (__dest = ImGui::MemAlloc((long)iVar184 * 0x110), iVar61 = iVar184, pvVar62 != (void *)0x0))
    {
      memcpy(__dest,pvVar62,(long)iVar92 * 0x110);
      ImGui::MemFree(pvVar62);
    }
  }
  uVar60 = (atlas->Fonts).Size;
  if (local_438._4_4_ < (int)uVar60) {
    if (local_438._4_4_ == 0) {
      uVar95 = 8;
    }
    else {
      uVar95 = local_438._4_4_ / 2 + local_438._4_4_;
    }
    if ((int)uVar95 <= (int)uVar60) {
      uVar95 = uVar60;
    }
    if (local_438._4_4_ < (int)uVar95) {
      pvVar62 = ImGui::MemAlloc((long)(int)uVar95 << 5);
      if (pvStack_430 != (void *)0x0) {
        memcpy(pvVar62,pvStack_430,(long)(int)local_438 << 5);
        ImGui::MemFree(pvStack_430);
      }
      local_438 = (ulong)uVar95 << 0x20;
      pvStack_430 = pvVar62;
    }
  }
  local_438 = CONCAT44(local_438._4_4_,uVar60);
  memset(__dest,0,(long)iVar185 * 0x110);
  memset(pvStack_430,0,(long)(int)local_438 << 5);
  iVar92 = (atlas->ConfigData).Size;
  iVar184 = CONCAT13(iVar92 < 1,(int3)in_stack_fffffffffffffb3c);
  if (0 < iVar92) {
    lVar90 = 0;
    pvVar62 = __dest;
    do {
      pIVar87 = (atlas->ConfigData).Data + lVar90;
      lVar72 = lVar90 * 0x110;
      *(undefined4 *)((long)pvVar62 + lVar72 + 0xe0) = 0xffffffff;
      uVar63 = (ulong)(atlas->Fonts).Size;
      __dest = pvVar62;
      if ((long)uVar63 < 1) goto LAB_00132eb9;
      pIVar14 = pIVar87->DstFont;
      ppIVar15 = (atlas->Fonts).Data;
      uVar85 = 0xffffffff;
      uVar83 = 0;
      do {
        if (pIVar14 == ppIVar15[uVar83]) {
          *(int *)((long)pvVar62 + lVar72 + 0xe0) = (int)uVar83;
          uVar85 = uVar83 & 0xffffffff;
        }
        uVar83 = uVar83 + 1;
      } while ((uVar83 < uVar63) && ((int)uVar85 == -1));
      if ((int)uVar85 == -1) goto LAB_00132eb9;
      local_458._0_8_ = lVar90;
      data = (stbtt_uint8 *)pIVar87->FontData;
      iVar92 = pIVar87->FontNo;
      sVar10 = *data;
      local_3e8._0_8_ = pIVar87;
      if (((((sVar10 == '1') && (data[1] == '\0')) && (data[2] == '\0')) && (data[3] == '\0')) ||
         (((sVar10 == 't' && (data[1] == 'y')) && ((data[2] == 'p' && (data[3] == '1')))))) {
LAB_0012fdd8:
        uVar60 = -(uint)(iVar92 != 0);
LAB_0012fde1:
        local_4b8._0_4_ = uVar60;
      }
      else {
        if (sVar10 == '\0') {
          if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_0012fdae;
          goto LAB_0012fdd8;
        }
        if ((((sVar10 == 'O') && (data[1] == 'T')) && (data[2] == 'T')) && (data[3] == 'O'))
        goto LAB_0012fdd8;
LAB_0012fdae:
        local_4b8._0_4_ = 0xffffffff;
        if (sVar10 == 't') {
          if (data[1] != 't') {
            if (((data[1] == 'r') && (data[2] == 'u')) && (data[3] == 'e')) goto LAB_0012fdd8;
            goto LAB_0012fe23;
          }
          if ((data[2] != 'c') || (data[3] != 'f')) goto LAB_0012fe23;
          uVar60 = *(uint *)(data + 4);
          uVar60 = uVar60 >> 0x18 | (uVar60 & 0xff0000) >> 8 | (uVar60 & 0xff00) << 8 |
                   uVar60 << 0x18;
          if (((uVar60 != 0x20000) && (uVar60 != 0x10000)) ||
             (uVar60 = *(uint *)(data + 8),
             (int)(uVar60 >> 0x18 | (uVar60 & 0xff0000) >> 8 | (uVar60 & 0xff00) << 8 |
                  uVar60 << 0x18) <= iVar92)) goto LAB_0012fe23;
          uVar60 = *(uint *)(data + (long)iVar92 * 4 + 0xc);
          uVar60 = uVar60 >> 0x18 | (uVar60 & 0xff0000) >> 8 | (uVar60 & 0xff00) << 8 |
                   uVar60 << 0x18;
          goto LAB_0012fde1;
        }
      }
LAB_0012fe23:
      *(stbtt_uint8 **)((long)pvVar62 + lVar72 + 8) = data;
      *(undefined4 *)((long)pvVar62 + lVar72 + 0x10) = local_4b8._0_4_;
      *(undefined8 *)((long)pvVar62 + lVar72 + 0x40) = 0;
      *(undefined8 *)((long)pvVar62 + lVar72 + 0x48) = 0;
      sVar54 = stbtt__find_table(data,local_4b8._0_4_,"cmap");
      auVar114 = local_478;
      local_478._4_4_ = extraout_var;
      local_478._0_4_ = sVar54;
      local_478._8_8_ = auVar114._8_8_;
      sVar54 = stbtt__find_table(data,local_4b8._0_4_,"loca");
      *(stbtt_uint32 *)((long)pvVar62 + lVar72 + 0x18) = sVar54;
      sVar55 = stbtt__find_table(data,local_4b8._0_4_,"head");
      *(stbtt_uint32 *)((long)pvVar62 + lVar72 + 0x1c) = sVar55;
      sVar56 = stbtt__find_table(data,local_4b8._0_4_,"glyf");
      *(stbtt_uint32 *)((long)pvVar62 + lVar72 + 0x20) = sVar56;
      sVar57 = stbtt__find_table(data,local_4b8._0_4_,"hhea");
      *(stbtt_uint32 *)((long)pvVar62 + lVar72 + 0x24) = sVar57;
      sVar58 = stbtt__find_table(data,local_4b8._0_4_,"hmtx");
      *(stbtt_uint32 *)((long)pvVar62 + lVar72 + 0x28) = sVar58;
      sVar59 = stbtt__find_table(data,local_4b8._0_4_,"kern");
      auVar114 = local_478;
      *(stbtt_uint32 *)((long)pvVar62 + lVar72 + 0x2c) = sVar59;
      uVar152 = local_478._0_8_;
      sVar59 = stbtt__find_table(data,local_4b8._0_4_,"GPOS");
      *(stbtt_uint32 *)((long)pvVar62 + lVar72 + 0x30) = sVar59;
      iVar92 = auVar114._0_4_;
      if ((((iVar92 == 0) || (sVar55 == 0)) || (sVar57 == 0)) || (sVar58 == 0)) goto LAB_00132eb9;
      if (sVar56 == 0) {
        local_428 = CONCAT44(local_428._4_4_,2);
        local_488._0_8_ = local_488._0_8_ & 0xffffffff00000000;
        local_410._0_4_ = 0;
        local_48c = 0;
        sVar56 = stbtt__find_table(data,local_4b8._0_4_,"CFF ");
        if (sVar56 == 0) goto LAB_00132eb9;
        *(undefined8 *)((long)pvVar62 + lVar72 + 0x90) = 0;
        *(undefined8 *)((long)pvVar62 + lVar72 + 0x98) = 0;
        *(undefined8 *)((long)pvVar62 + lVar72 + 0x80) = 0;
        *(undefined8 *)((long)pvVar62 + lVar72 + 0x88) = 0;
        *(stbtt_uint8 **)((long)pvVar62 + lVar72 + 0x40) = data + sVar56;
        *(undefined8 *)((long)pvVar62 + lVar72 + 0x48) = 0x2000000000000000;
        local_288[0].data = *(uchar **)((long)pvVar62 + lVar72 + 0x40);
        uVar170 = *(undefined8 *)((long)pvVar62 + lVar72 + 0x48);
        local_288[0].cursor = (int)uVar170;
        local_288[0].size = (int)((ulong)uVar170 >> 0x20);
        uVar60 = local_288[0].cursor + 2U;
        if (local_288[0].size < (int)(local_288[0].cursor + 2U)) {
          uVar60 = local_288[0].size;
        }
        if (local_288[0].cursor < -2) {
          uVar60 = local_288[0].size;
        }
        local_288[0].cursor = 0;
        if ((int)uVar60 < local_288[0].size) {
          local_288[0].cursor = (int)local_288[0].data[(int)uVar60];
        }
        if (local_288[0].size < local_288[0].cursor) {
          local_288[0].cursor = local_288[0].size;
        }
        stbtt__cff_get_index(local_288);
        sVar183 = stbtt__cff_get_index(local_288);
        local_448 = (undefined1  [16])stbtt__cff_index_get(sVar183,0);
        stbtt__cff_get_index(local_288);
        sVar183 = stbtt__cff_get_index(local_288);
        *(stbtt__buf *)((long)pvVar62 + lVar72 + 0x60) = sVar183;
        stbtt__dict_get_ints((stbtt__buf *)local_448,0x11,1,(stbtt_uint32 *)local_488);
        stbtt__dict_get_ints((stbtt__buf *)local_448,0x106,1,(stbtt_uint32 *)&local_428);
        stbtt__dict_get_ints((stbtt__buf *)local_448,0x124,1,(stbtt_uint32 *)&local_410);
        stbtt__dict_get_ints((stbtt__buf *)local_448,0x125,1,&local_48c);
        sVar183.data._4_4_ = sVar54;
        sVar183.data._0_4_ = in_stack_fffffffffffffb30;
        sVar183.cursor = sVar55;
        sVar183.size = iVar184;
        fontdict.data._4_4_ = iVar61;
        fontdict.data._0_4_ = iVar185;
        fontdict._8_8_ = __dest;
        sVar183 = stbtt__get_subrs(sVar183,fontdict);
        sVar54 = local_48c;
        *(stbtt__buf *)((long)pvVar62 + lVar72 + 0x70) = sVar183;
        if (((stbtt_uint32)local_428 != 2) || (uVar150 = local_488._0_4_, local_488._0_4_ == 0))
        goto LAB_00132eb9;
        if ((stbtt_uint32)local_410 != 0) {
          uVar63 = (ulong)local_48c;
          if (uVar63 == 0) goto LAB_00132eb9;
          local_288[0].cursor = (stbtt_uint32)local_410;
          if (local_288[0].size < (int)(stbtt_uint32)local_410) {
            local_288[0].cursor = local_288[0].size;
          }
          if ((int)(stbtt_uint32)local_410 < 0) {
            local_288[0].cursor = local_288[0].size;
          }
          sVar183 = stbtt__cff_get_index(local_288);
          *(stbtt__buf *)((long)pvVar62 + lVar72 + 0x80) = sVar183;
          puVar66 = local_288[0].data + uVar63;
          lVar90 = (ulong)(local_288[0].size - sVar54) << 0x20;
          if ((int)(local_288[0].size - sVar54 | sVar54) < 0 || local_288[0].size < (int)sVar54) {
            puVar66 = (uchar *)0x0;
            lVar90 = 0;
          }
          *(uchar **)((long)pvVar62 + lVar72 + 0x90) = puVar66;
          *(long *)((long)pvVar62 + lVar72 + 0x98) = lVar90;
        }
        local_288[0].cursor = uVar150;
        if (local_288[0].size < (int)uVar150) {
          local_288[0].cursor = local_288[0].size;
        }
        if ((int)uVar150 < 0) {
          local_288[0].cursor = local_288[0].size;
        }
        sVar183 = stbtt__cff_get_index(local_288);
        *(stbtt__buf *)((long)pvVar62 + lVar72 + 0x50) = sVar183;
      }
      else if (sVar54 == 0) goto LAB_00132eb9;
      sVar54 = stbtt__find_table(data,local_4b8._0_4_,"maxp");
      if (sVar54 == 0) {
        uVar60 = 0xffff;
      }
      else {
        uVar60 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar54 + 4) << 8 |
                               *(ushort *)(data + (ulong)sVar54 + 4) >> 8);
      }
      *(uint *)((long)pvVar62 + lVar72 + 0x14) = uVar60;
      uVar52 = *(ushort *)(data + (uVar152 & 0xffffffff) + 2) << 8 |
               *(ushort *)(data + (uVar152 & 0xffffffff) + 2) >> 8;
      *(undefined4 *)((long)pvVar62 + lVar72 + 0x34) = 0;
      if (uVar52 != 0) {
        uVar60 = iVar92 + 4;
        uVar63 = (ulong)uVar52;
        do {
          uVar52 = *(ushort *)(data + uVar60) << 8 | *(ushort *)(data + uVar60) >> 8;
          if ((uVar52 == 0) ||
             ((uVar52 == 3 &&
              ((uVar52 = *(ushort *)(data + (ulong)uVar60 + 2) << 8 |
                         *(ushort *)(data + (ulong)uVar60 + 2) >> 8, uVar52 == 10 || (uVar52 == 1)))
              ))) {
            uVar95 = *(uint *)(data + (ulong)uVar60 + 4);
            *(uint *)((long)pvVar62 + lVar72 + 0x34) =
                 (uVar95 >> 0x18 | (uVar95 & 0xff0000) >> 8 | (uVar95 & 0xff00) << 8 |
                 uVar95 << 0x18) + iVar92;
          }
          uVar60 = uVar60 + 8;
          uVar63 = uVar63 - 1;
        } while (uVar63 != 0);
      }
      if (*(int *)((long)pvVar62 + lVar72 + 0x34) == 0) goto LAB_00132eb9;
      *(uint *)((long)pvVar62 + lVar72 + 0x38) =
           (uint)(ushort)(*(ushort *)(data + (long)(int)sVar55 + 0x32) << 8 |
                         *(ushort *)(data + (long)(int)sVar55 + 0x32) >> 8);
      piVar64 = (int *)((long)*(int *)((long)pvVar62 + lVar72 + 0xe0) * 0x20 + (long)pvStack_430);
      pIVar73 = *(ImWchar **)(local_3e8._0_8_ + 0x38);
      if (pIVar73 == (ImWchar *)0x0) {
        pIVar73 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvVar62 + lVar72 + 0xd8) = pIVar73;
      IVar12 = *pIVar73;
      while (IVar12 != 0) {
        uVar52 = pIVar73[1];
        if (uVar52 == 0) break;
        uVar60 = *(uint *)((long)pvVar62 + lVar72 + 0xe4);
        uVar95 = (uint)uVar52;
        if ((int)(uint)uVar52 < (int)uVar60) {
          uVar95 = uVar60;
        }
        *(uint *)((long)pvVar62 + lVar72 + 0xe4) = uVar95;
        IVar12 = pIVar73[2];
        pIVar73 = pIVar73 + 2;
      }
      *piVar64 = *piVar64 + 1;
      iVar92 = *(int *)((long)pvVar62 + lVar72 + 0xe4);
      if (iVar92 < piVar64[1]) {
        iVar92 = piVar64[1];
      }
      piVar64[1] = iVar92;
      lVar90 = local_458._0_8_ + 1;
      lVar72 = (long)(atlas->ConfigData).Size;
      iVar184 = CONCAT13(lVar72 <= lVar90,(int3)iVar184);
      pvVar62 = __dest;
    } while (lVar90 < lVar72);
  }
  auVar91 = (undefined1  [8])0x0;
  if (0 < iVar185) {
    lVar90 = 0;
    auVar91 = (undefined1  [8])0x0;
    pvVar62 = __dest;
    do {
      lVar72 = lVar90 * 0x110;
      pvVar93 = (void *)((long)*(int *)((long)pvVar62 + lVar72 + 0xe0) * 0x20 + (long)pvStack_430);
      __dest = pvVar62;
      ImBitVector::Create((ImBitVector *)((long)pvVar62 + lVar72 + 0xf0),
                          *(int *)((long)pvVar62 + lVar72 + 0xe4) + 1);
      if (*(int *)((long)pvVar93 + 0x10) == 0) {
        ImBitVector::Create((ImBitVector *)((long)pvVar93 + 0x10),*(int *)((long)pvVar93 + 4) + 1);
      }
      local_458._0_8_ = lVar90;
      psVar80 = (stbtt_fontinfo *)((long)pvVar62 + lVar72);
      puVar74 = *(ushort **)&psVar80[1].indexToLocFormat;
      uVar52 = *puVar74;
      if (uVar52 != 0) {
        local_478._0_8_ = pvVar93;
        do {
          uVar111 = puVar74[1];
          if (uVar111 == 0) break;
          local_4b8 = auVar91;
          if (uVar52 <= uVar111) {
            uVar60 = (uint)uVar52;
            lVar90 = *(long *)(local_478._0_8_ + 0x18);
            do {
              auVar114 = _local_4b8;
              uVar95 = 1 << ((byte)uVar60 & 0x1f);
              if (((*(uint *)(lVar90 + (ulong)(uVar60 >> 5) * 4) >> (uVar60 & 0x1f) & 1) == 0) &&
                 (iVar61 = stbtt_FindGlyphIndex(psVar80,uVar60), iVar61 != 0)) {
                piVar64 = &psVar80[1].cff.cursor;
                *piVar64 = *piVar64 + 1;
                *(int *)(local_478._0_8_ + 8) = *(int *)(local_478._0_8_ + 8) + 1;
                uVar63 = (ulong)((uVar60 >> 5) << 2);
                puVar1 = (uint *)(*(long *)&psVar80[1].charstrings.cursor + uVar63);
                *puVar1 = *puVar1 | uVar95;
                puVar1 = (uint *)(lVar90 + uVar63);
                *puVar1 = *puVar1 | uVar95;
                iVar61 = local_4b8._0_4_;
                local_4b8._4_4_ = 0;
                local_4b8._0_4_ = iVar61 + 1;
                _fStack_4b0 = auVar114._8_8_;
              }
              uVar60 = uVar60 + 1;
            } while (uVar111 + 1 != uVar60);
          }
          uVar52 = puVar74[2];
          puVar74 = puVar74 + 2;
          auVar91 = local_4b8;
        } while (uVar52 != 0);
      }
      lVar90 = local_458._0_8_ + 1;
      pvVar62 = __dest;
    } while (lVar90 < iVar185);
  }
  local_4b8 = auVar91;
  if (0 < iVar185) {
    lVar90 = 0;
    pvVar62 = __dest;
    do {
      lVar72 = lVar90 * 0x110;
      iVar61 = *(int *)((long)pvVar62 + lVar72 + 0xe8);
      __dest = pvVar62;
      if (*(int *)((long)pvVar62 + lVar72 + 0x104) < iVar61) {
        pvVar65 = ImGui::MemAlloc((long)iVar61 << 2);
        pvVar93 = *(void **)((long)pvVar62 + lVar72 + 0x108);
        if (pvVar93 != (void *)0x0) {
          memcpy(pvVar65,pvVar93,(long)*(int *)((long)pvVar62 + lVar72 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)pvVar62 + lVar72 + 0x108));
        }
        *(void **)((long)pvVar62 + lVar72 + 0x108) = pvVar65;
        *(int *)((long)pvVar62 + lVar72 + 0x104) = iVar61;
      }
      local_458._0_8_ = lVar90;
      lVar90 = (long)*(int *)((long)pvVar62 + lVar72 + 0xf0);
      if (0 < lVar90) {
        puVar75 = *(uint **)((long)pvVar62 + lVar72 + 0xf8);
        puVar1 = puVar75 + lVar90;
        iVar61 = 0;
        do {
          local_478._0_8_ = puVar75;
          uVar60 = *puVar75;
          if (uVar60 != 0) {
            uVar95 = 0;
            do {
              if ((uVar60 >> (uVar95 & 0x1f) & 1) != 0) {
                iVar92 = *(int *)((long)pvVar62 + lVar72 + 0x100);
                iVar89 = *(int *)((long)pvVar62 + lVar72 + 0x104);
                if (iVar92 == iVar89) {
                  if (iVar89 == 0) {
                    iVar71 = 8;
                  }
                  else {
                    iVar71 = iVar89 / 2 + iVar89;
                  }
                  iVar92 = iVar92 + 1;
                  if (iVar92 < iVar71) {
                    iVar92 = iVar71;
                  }
                  if (iVar89 < iVar92) {
                    pvVar65 = ImGui::MemAlloc((long)iVar92 << 2);
                    pvVar93 = *(void **)((long)pvVar62 + lVar72 + 0x108);
                    if (pvVar93 != (void *)0x0) {
                      memcpy(pvVar65,pvVar93,(long)*(int *)((long)pvVar62 + lVar72 + 0x100) << 2);
                      ImGui::MemFree(*(void **)((long)pvVar62 + lVar72 + 0x108));
                    }
                    *(void **)((long)pvVar62 + lVar72 + 0x108) = pvVar65;
                    *(int *)((long)pvVar62 + lVar72 + 0x104) = iVar92;
                  }
                }
                *(uint *)(*(long *)((long)pvVar62 + lVar72 + 0x108) +
                         (long)*(int *)((long)pvVar62 + lVar72 + 0x100) * 4) = iVar61 + uVar95;
                piVar64 = (int *)((long)pvVar62 + lVar72 + 0x100);
                *piVar64 = *piVar64 + 1;
              }
              uVar95 = uVar95 + 1;
            } while (uVar95 != 0x20);
          }
          puVar75 = (uint *)(local_478._0_8_ + 4);
          iVar61 = iVar61 + 0x20;
        } while (puVar75 < puVar1);
      }
      pvVar93 = *(void **)((long)pvVar62 + lVar72 + 0xf8);
      uVar152 = local_458._0_8_;
      if (pvVar93 != (void *)0x0) {
        *(undefined8 *)((long)pvVar62 + lVar72 + 0xf0) = 0;
        ImGui::MemFree(pvVar93);
        *(undefined8 *)((long)pvVar62 + lVar72 + 0xf8) = 0;
      }
      lVar90 = uVar152 + 1;
      pvVar62 = __dest;
    } while (lVar90 < iVar185);
  }
  uVar60 = SUB84(auVar91,0);
  if (0 < (int)local_438) {
    lVar90 = 0x18;
    lVar72 = 0;
    do {
      pvVar62 = pvStack_430;
      if (*(void **)((long)pvStack_430 + lVar90) != (void *)0x0) {
        *(undefined8 *)((long)pvStack_430 + lVar90 + -8) = 0;
        ImGui::MemFree(*(void **)((long)pvStack_430 + lVar90));
        *(undefined8 *)((long)pvVar62 + lVar90) = 0;
      }
      lVar72 = lVar72 + 1;
      lVar90 = lVar90 + 0x20;
    } while (lVar72 < (int)local_438);
  }
  if (pvStack_430 != (void *)0x0) {
    local_438 = 0;
    ImGui::MemFree(pvStack_430);
    pvStack_430 = (void *)0x0;
  }
  local_448 = ZEXT816(0);
  local_428 = 0;
  pvStack_420 = (void *)0x0;
  if (0 < (int)uVar60) {
    uVar95 = 8;
    if (7 < (int)uVar60) {
      uVar95 = uVar60;
    }
    if (0 < (int)uVar95) {
      pvVar62 = ImGui::MemAlloc((long)(int)uVar95 << 4);
      if ((void *)local_448._8_8_ != (void *)0x0) {
        memcpy(pvVar62,(void *)local_448._8_8_,(long)(int)local_448._0_4_ << 4);
        ImGui::MemFree((void *)local_448._8_8_);
      }
      auVar114._4_8_ = pvVar62;
      auVar114._0_4_ = uVar95;
      auVar114._12_4_ = 0;
      local_448 = auVar114 << 0x20;
    }
  }
  local_448._0_4_ = uVar60;
  if (local_428._4_4_ < (int)uVar60) {
    if (local_428._4_4_ == 0) {
      uVar95 = 8;
    }
    else {
      uVar95 = local_428._4_4_ / 2 + local_428._4_4_;
    }
    if ((int)uVar95 <= (int)uVar60) {
      uVar95 = uVar60;
    }
    if (local_428._4_4_ < (int)uVar95) {
      pvVar62 = ImGui::MemAlloc((long)(int)uVar95 * 0x1c);
      if (pvStack_420 != (void *)0x0) {
        memcpy(pvVar62,pvStack_420,(long)(int)(stbtt_uint32)local_428 * 0x1c);
        ImGui::MemFree(pvStack_420);
      }
      local_428 = (ulong)uVar95 << 0x20;
      pvStack_420 = pvVar62;
    }
  }
  local_428 = CONCAT44(local_428._4_4_,uVar60);
  iVar61 = 0;
  memset((void *)local_448._8_8_,0,(long)(int)local_448._0_4_ << 4);
  memset(pvStack_420,0,(long)(int)(stbtt_uint32)local_428 * 0x1c);
  fVar113 = 0.0;
  if (0 < iVar185) {
    lVar90 = 0;
    iVar89 = 0;
    iVar92 = 0;
    do {
      iVar71 = *(int *)((long)__dest + lVar90 * 0x110 + 0xe8);
      if (iVar71 != 0) {
        psVar80 = (stbtt_fontinfo *)((long)__dest + lVar90 * 0x110);
        *(long *)&psVar80[1].hmtx = (long)iVar89 * 0x10 + local_448._8_8_;
        pvVar62 = (void *)((long)iVar92 * 0x1c + (long)pvStack_420);
        *(void **)&psVar80[1].gpos = pvVar62;
        pIVar87 = (atlas->ConfigData).Data;
        fVar113 = pIVar87[lVar90].SizePixels;
        uVar150 = 0;
        uVar168 = 0;
        uVar122 = 0;
        *(float *)&psVar80[1].userdata = fVar113;
        *(undefined4 *)((long)&psVar80[1].userdata + 4) = 0;
        psVar80[1].data = *(uchar **)&psVar80[1].gsubrs.cursor;
        psVar80[1].fontstart = *(int *)&psVar80[1].gsubrs.data;
        *(void **)&psVar80[1].loca = pvVar62;
        *(char *)&psVar80[1].glyf = (char)pIVar87[lVar90].OversampleH;
        *(char *)((long)&psVar80[1].glyf + 1) = (char)pIVar87[lVar90].OversampleV;
        if (fVar113 <= 0.0) {
          uVar150 = 0x80000000;
          uVar168 = 0x80000000;
          uVar122 = 0x80000000;
          fVar113 = -fVar113;
          uVar60 = (uint)(ushort)(*(ushort *)(psVar80->data + (long)psVar80->head + 0x12) << 8 |
                                 *(ushort *)(psVar80->data + (long)psVar80->head + 0x12) >> 8);
        }
        else {
          puVar66 = psVar80->data;
          lVar72 = (long)psVar80->hhea;
          uVar60 = ((int)(short)((ushort)puVar66[lVar72 + 4] << 8) | (uint)puVar66[lVar72 + 5]) -
                   ((int)(short)((ushort)puVar66[lVar72 + 6] << 8) | (uint)puVar66[lVar72 + 7]);
        }
        fVar113 = fVar113 / (float)(int)uVar60;
        iVar89 = iVar89 + iVar71;
        iVar92 = iVar92 + iVar71;
        if (0 < *(int *)&psVar80[1].gsubrs.data) {
          local_458._0_4_ = iVar92;
          local_478._0_8_ = lVar90;
          iVar92 = atlas->TexGlyphPadding;
          lVar96 = 6;
          lVar72 = 0;
          local_4b8._4_4_ = uVar150;
          local_4b8._0_4_ = fVar113;
          fStack_4b0 = (float)uVar168;
          fStack_4ac = (float)uVar122;
          do {
            iVar71 = stbtt_FindGlyphIndex
                               (psVar80,*(int *)(*(long *)&psVar80[1].gsubrs.cursor + lVar72 * 4));
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar80,iVar71,(float)pIVar87[lVar90].OversampleH * fVar113,
                       (float)pIVar87[lVar90].OversampleV * fVar113,fVar113,in_XMM3._0_4_,
                       (int *)local_288,(int *)local_488,(int *)&local_410,(int *)&local_48c);
            uVar60 = (pIVar87[lVar90].OversampleH +
                     (((stbtt_uint32)local_410 + iVar92) - (int)local_288[0].data)) - 1;
            lVar78 = *(long *)&psVar80[1].hmtx;
            *(short *)(lVar78 + -2 + lVar96) = (short)uVar60;
            uVar95 = (pIVar87[lVar90].OversampleV + ((local_48c + iVar92) - local_488._0_4_)) - 1;
            *(short *)(lVar78 + lVar96) = (short)uVar95;
            iVar61 = iVar61 + (uVar95 & 0xffff) * (uVar60 & 0xffff);
            lVar72 = lVar72 + 1;
            lVar96 = lVar96 + 0x10;
          } while (lVar72 < *(int *)&psVar80[1].gsubrs.data);
          lVar90 = local_478._0_8_;
          iVar92 = local_458._0_4_;
        }
      }
      lVar90 = lVar90 + 1;
    } while (lVar90 < iVar185);
    fVar113 = (float)iVar61;
  }
  if (fVar113 < 0.0) {
    fVar113 = sqrtf(fVar113);
  }
  else {
    fVar113 = SQRT(fVar113);
  }
  atlas->TexHeight = 0;
  iVar61 = atlas->TexDesiredWidth;
  if (iVar61 < 1) {
    iVar92 = (int)fVar113;
    iVar61 = 0x1000;
    if ((iVar92 < 0xb33) && (iVar61 = 0x800, iVar92 < 0x599)) {
      iVar61 = (uint)(0x2cb < iVar92) * 0x200 + 0x200;
    }
  }
  atlas->TexWidth = iVar61;
  local_488._12_4_ = atlas->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar92 = iVar61 - local_488._12_4_;
  local_418 = (stbrp_node *)ImGui::MemAlloc((long)iVar92 << 4);
  if ((ptr == (stbrp_context *)0x0) || (local_418 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_418 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_418);
    }
    local_418 = (stbrp_node *)0x0;
    local_488._12_4_ = 0.0;
    iVar61 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (iVar92 < 2) {
      uVar63 = 0;
    }
    else {
      uVar63 = 0;
      psVar32 = local_418;
      do {
        uVar63 = uVar63 + 1;
        psVar32->next = psVar32 + 1;
        psVar32 = psVar32 + 1;
      } while (iVar92 - 1 != uVar63);
      uVar63 = uVar63 & 0xffffffff;
    }
    local_418[uVar63].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_418;
    ptr->active_head = ptr->extra;
    ptr->width = iVar92;
    ptr->height = 0x8000 - local_488._12_4_;
    ptr->num_nodes = iVar92;
    ptr->align = (iVar92 * 2 + -1) / iVar92;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar92;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_360 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas,ptr);
  if (0 < iVar185) {
    lVar90 = 0;
    pvVar62 = __dest;
    do {
      lVar72 = lVar90 * 0x110;
      iVar92 = *(int *)((long)pvVar62 + lVar72 + 0xe8);
      __dest = pvVar62;
      if (iVar92 != 0) {
        stbrp_pack_rects(local_360,*(stbrp_rect **)((long)pvVar62 + lVar72 + 200),iVar92);
        lVar96 = (long)*(int *)((long)pvVar62 + lVar72 + 0xe8);
        if (0 < lVar96) {
          lVar72 = *(long *)((long)pvVar62 + lVar72 + 200);
          lVar78 = 0;
          do {
            if (*(int *)(lVar72 + 0xc + lVar78) != 0) {
              iVar92 = (uint)*(ushort *)(lVar72 + 6 + lVar78) +
                       (uint)*(ushort *)(lVar72 + 10 + lVar78);
              if (iVar92 < atlas->TexHeight) {
                iVar92 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar92;
            }
            lVar78 = lVar78 + 0x10;
          } while (lVar96 * 0x10 != lVar78);
        }
      }
      lVar90 = lVar90 + 1;
      pvVar62 = __dest;
    } while (lVar90 < iVar185);
  }
  uVar60 = atlas->TexHeight;
  if ((atlas->Flags & 1) == 0) {
    uVar60 = (int)(uVar60 - 1) >> 1 | uVar60 - 1;
    uVar60 = (int)uVar60 >> 2 | uVar60;
    uVar60 = (int)uVar60 >> 4 | uVar60;
    uVar60 = (int)uVar60 >> 8 | uVar60;
    uVar60 = (int)uVar60 >> 0x10 | uVar60;
  }
  iVar92 = uVar60 + 1;
  atlas->TexHeight = iVar92;
  auVar116._0_4_ = (float)atlas->TexWidth;
  auVar116._4_4_ = (float)iVar92;
  auVar116._8_8_ = 0;
  auVar114 = divps(_DAT_0017a2d0,auVar116);
  atlas->TexUvScale = auVar114._0_8_;
  puVar66 = (uchar *)ImGui::MemAlloc((long)(iVar92 * atlas->TexWidth));
  atlas->TexPixelsAlpha8 = puVar66;
  memset(puVar66,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
  if (0 < iVar185) {
    local_3c0 = atlas->TexPixelsAlpha8;
    local_460 = (long)iVar61;
    local_68 = pshuflw(ZEXT416((uint)local_488._12_4_),ZEXT416((uint)local_488._12_4_),0);
    local_37c = iVar61;
    lVar90 = 0;
    auVar116 = _DAT_0017a2b0;
    auVar114 = _DAT_0017d760;
    do {
      if (*(int *)((long)__dest + lVar90 * 0x110 + 0xe8) != 0) {
        psVar80 = (stbtt_fontinfo *)((long)__dest + lVar90 * 0x110);
        local_328 = *(float *)&psVar80[1].userdata;
        local_300 = lVar90;
        if (local_328 <= 0.0) {
          local_328 = (float)((uint)local_328 ^ auVar116._0_4_);
          uStack_324 = auVar116._4_4_;
          uStack_320 = auVar116._8_4_;
          uStack_31c = auVar116._12_4_;
          uVar60 = (uint)(ushort)(*(ushort *)(psVar80->data + (long)psVar80->head + 0x12) << 8 |
                                 *(ushort *)(psVar80->data + (long)psVar80->head + 0x12) >> 8);
        }
        else {
          puVar66 = psVar80->data;
          lVar90 = (long)psVar80->hhea;
          uVar60 = ((int)(short)((ushort)puVar66[lVar90 + 4] << 8) | (uint)puVar66[lVar90 + 5]) -
                   ((int)(short)((ushort)puVar66[lVar90 + 6] << 8) | (uint)puVar66[lVar90 + 7]);
          uStack_324 = 0;
          uStack_320 = 0;
          uStack_31c = 0;
        }
        local_328 = local_328 / (float)(int)uVar60;
        local_308 = (atlas->ConfigData).Data;
        if (0 < psVar80[1].fontstart) {
          lVar90._0_4_ = psVar80[1].hmtx;
          lVar90._4_4_ = psVar80[1].kern;
          local_298._0_4_ = psVar80[1].glyf;
          local_298._4_4_ = psVar80[1].hhea;
          uStack_290 = 0;
          auVar43._8_6_ = 0;
          auVar43._0_8_ = local_298;
          auVar43[0xe] = (char)((uint)local_298._4_4_ >> 0x18);
          auVar46._8_4_ = 0;
          auVar46._0_8_ = local_298;
          auVar46[0xc] = (char)((uint)local_298._4_4_ >> 0x10);
          auVar46._13_2_ = auVar43._13_2_;
          auVar47._8_4_ = 0;
          auVar47._0_8_ = local_298;
          auVar47._12_3_ = auVar46._12_3_;
          auVar48._8_2_ = 0;
          auVar48._0_8_ = local_298;
          auVar48[10] = (char)((uint)local_298._4_4_ >> 8);
          auVar48._11_4_ = auVar47._11_4_;
          auVar49._8_2_ = 0;
          auVar49._0_8_ = local_298;
          auVar49._10_5_ = auVar48._10_5_;
          auVar50[8] = (char)local_298._4_4_;
          auVar50._0_8_ = local_298;
          auVar50._9_6_ = auVar49._9_6_;
          cVar109 = (char)((uint)(undefined4)local_298 >> 0x18);
          Var36 = CONCAT91((unkuint9)auVar50._8_7_ << 8,cVar109);
          auVar41[10] = 0;
          auVar41._0_10_ = Var36;
          cVar108 = (char)((uint)(undefined4)local_298 >> 0x10);
          auVar35._1_11_ = auVar41 << 8;
          auVar35[0] = cVar108;
          auVar40[0xc] = 0;
          auVar40._0_12_ = auVar35;
          bVar107 = (byte)((uint)(undefined4)local_298 >> 8);
          auVar34._1_13_ = auVar40 << 8;
          auVar34[0] = bVar107;
          bVar99 = (byte)(undefined4)local_298;
          auVar163._0_2_ = CONCAT11(0,bVar99);
          auVar163._2_14_ = auVar34;
          uVar52 = auVar34._0_2_;
          sVar13 = -auVar35._0_2_;
          uVar111 = (ushort)Var36;
          sVar53 = -uVar111;
          local_3d8 = (ulong)uVar52;
          auVar44._10_2_ = 0;
          auVar44._0_10_ = auVar163._0_10_;
          auVar44._12_2_ = uVar111;
          uVar51 = CONCAT42(auVar44._10_4_,auVar35._0_2_);
          auVar101._4_2_ = uVar52;
          auVar101._0_4_ = auVar163._0_4_;
          auVar101._6_10_ = (unkuint10)uVar51 << 0x10;
          auVar102._0_4_ = (float)auVar163._0_2_;
          auVar102._4_4_ = (float)auVar101._4_4_;
          auVar102._8_4_ = (float)(int)uVar51;
          auVar102._12_4_ = (float)uVar111;
          local_58 = divps(_DAT_0017a2d0,auVar102);
          auVar134[0] = -(bVar99 == 0);
          auVar134[1] = -(bVar99 == 0);
          auVar134[2] = -(bVar99 == 0);
          auVar134[3] = -(bVar99 == 0);
          auVar134[4] = -(bVar107 == 0);
          auVar134[5] = -(bVar107 == 0);
          auVar134[6] = -(bVar107 == 0);
          auVar134[7] = -(bVar107 == 0);
          auVar134[8] = -(cVar108 == '\0');
          auVar134[9] = -(cVar108 == '\0');
          auVar134[10] = -(cVar108 == '\0');
          auVar134[0xb] = -(cVar108 == '\0');
          auVar134[0xc] = -(cVar109 == '\0');
          auVar134[0xd] = -(cVar109 == '\0');
          auVar134[0xe] = -(cVar109 == '\0');
          auVar134[0xf] = -(cVar109 == '\0');
          Var39 = CONCAT64(CONCAT42(CONCAT22(sVar53,sVar53),sVar13),CONCAT22(sVar13,sVar53));
          auVar37._4_8_ = (long)((unkuint10)Var39 >> 0x10);
          auVar37._2_2_ = 1 - uVar52;
          auVar37._0_2_ = 1 - uVar52;
          auVar115._0_4_ = (float)(int)(short)(1 - auVar163._0_2_);
          auVar115._4_4_ = (float)(auVar37._0_4_ >> 0x10);
          auVar115._8_4_ = (float)((int)((unkuint10)Var39 >> 0x10) >> 0x10);
          auVar115._12_4_ = (float)(int)sVar53;
          local_2a8 = local_328 * auVar102._0_4_;
          local_2b8 = local_328 * auVar102._4_4_;
          auVar103._0_4_ = auVar102._0_4_ + auVar102._0_4_;
          auVar103._4_4_ = auVar102._4_4_ + auVar102._4_4_;
          auVar103._8_4_ = auVar102._8_4_ + auVar102._8_4_;
          auVar103._12_4_ = auVar102._12_4_ + auVar102._12_4_;
          auVar116 = divps(auVar115,auVar103);
          local_48._0_16_ = ~auVar134 & auVar116;
          fVar113 = local_2b8;
          if (local_2a8 <= local_2b8) {
            fVar113 = local_2a8;
          }
          local_3d0 = (0.35 / fVar113) * (0.35 / fVar113);
          fStack_2b4 = local_2b8;
          fStack_2b0 = local_2b8;
          fStack_2ac = local_2b8;
          fStack_74 = (float)((uint)local_2b8 ^ (uint)DAT_0017a2b0);
          local_338 = local_298 & 0xff;
          local_340 = (ulong)bVar107;
          local_468 = (ulong)(auVar163._0_4_ & 0xffff);
          fStack_2a4 = local_2b8;
          fStack_2a0 = local_328 * auVar102._8_4_;
          fStack_29c = local_328 * auVar102._12_4_;
          local_78 = local_2a8;
          fStack_70 = local_2a8;
          fStack_6c = fStack_74;
          lVar72 = 0;
          local_2f8 = lVar90;
          local_350 = psVar80;
          auVar116 = _DAT_0017a2b0;
          do {
            fVar113 = 0.0;
            if (*(int *)(lVar90 + 0xc + lVar72 * 0x10) != 0) {
              lVar96 = lVar72 * 0x10 + lVar90;
              sVar13 = *(short *)(lVar96 + 4);
              if ((sVar13 != 0) && (sVar53 = *(short *)(lVar96 + 6), sVar53 != 0)) {
                if (psVar80[1].data == (uchar *)0x0) {
                  iVar61 = *(int *)((long)&psVar80[1].userdata + 4) + (int)lVar72;
                }
                else {
                  iVar61 = *(int *)(psVar80[1].data + lVar72 * 4);
                }
                local_2f0 = (undefined4 *)(lVar72 * 0x1c + *(long *)&psVar80[1].loca);
                local_2e8 = lVar72;
                iVar92 = stbtt_FindGlyphIndex(psVar80,iVar61);
                fVar100 = auVar114._0_4_;
                *(uint *)(lVar96 + 8) =
                     CONCAT22((short)((uint)*(undefined4 *)(lVar96 + 8) >> 0x10) + local_68._2_2_,
                              (short)*(undefined4 *)(lVar96 + 8) + local_68._0_2_);
                *(short *)(lVar96 + 4) = sVar13 - (short)local_488._12_4_;
                *(short *)(lVar96 + 6) = sVar53 - (short)local_488._12_4_;
                puVar66 = psVar80->data;
                uVar52 = *(ushort *)(puVar66 + (long)psVar80->hhea + 0x22) << 8 |
                         *(ushort *)(puVar66 + (long)psVar80->hhea + 0x22) >> 8;
                iVar61 = psVar80->hmtx;
                lVar90 = (ulong)uVar52 * 4 + (long)iVar61 + -4;
                lVar72 = (ulong)uVar52 * 4 + (long)iVar61 + -3;
                if (iVar92 < (int)(uint)uVar52) {
                  lVar90 = (long)(iVar92 * 4) + (long)iVar61;
                  lVar72 = (long)(iVar92 * 4) + 1 + (long)iVar61;
                }
                local_380 = (uint)puVar66[lVar90];
                local_384 = (uint)puVar66[lVar72];
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar80,iVar92,local_2a8,local_2b8,fVar113,fVar100,&local_368,&local_36c,
                           &local_2bc,&local_2c0);
                auVar114 = local_458;
                local_458._2_6_ = 0;
                local_458._0_2_ = *(ushort *)(lVar96 + 8);
                local_458._8_8_ = auVar114._8_8_;
                local_3a8 = (uchar *)(ulong)*(ushort *)(lVar96 + 10);
                local_3f0 = (ulong)*(ushort *)(lVar96 + 4);
                local_3c8 = (ulong)*(ushort *)(lVar96 + 6);
                local_3b8 = lVar96;
                uVar60 = stbtt_GetGlyphShape(psVar80,iVar92,(stbtt_vertex **)&local_410);
                uVar95 = ((int)local_3f0 - (int)local_468) + 1;
                local_358 = (ulong)(uint)-(int)local_3d8;
                stbtt_GetGlyphBitmapBoxSubpixel
                          (local_350,iVar92,local_2a8,local_2b8,fVar113,fVar100,(int *)&local_48c,
                           &local_364,(int *)0x0,(int *)0x0);
                local_3fc = uVar95;
                if (uVar95 != 0) {
                  iVar61 = (int)local_358 + (int)local_3c8 + 1;
                  local_3e8._0_4_ = iVar61;
                  if (iVar61 != 0) {
                    lVar90 = CONCAT44(local_410._4_4_,(stbtt_uint32)local_410);
                    local_404 = local_364;
                    local_288[0].data = (uchar *)((ulong)local_288[0].data & 0xffffffff00000000);
                    if ((int)uVar60 < 1) {
                      uVar63 = 0;
                    }
                    else {
                      lVar72 = 0;
                      uVar63 = 0;
                      do {
                        uVar63 = (ulong)((int)uVar63 +
                                        (uint)(*(char *)(lVar90 + 0xc + lVar72) == '\x01'));
                        lVar72 = lVar72 + 0xe;
                      } while ((ulong)uVar60 * 0xe != lVar72);
                    }
                    sVar54 = local_48c;
                    if ((int)uVar63 == 0) {
LAB_00131472:
                      pvVar62 = (void *)0x0;
LAB_00131475:
                      points = (stbtt__point *)0x0;
                    }
                    else {
                      pvVar62 = ImGui::MemAlloc((long)(int)uVar63 << 2);
                      if (pvVar62 == (void *)0x0) {
                        uVar63 = 0;
                        goto LAB_00131475;
                      }
                      uVar95 = 0;
                      auVar91 = (undefined1  [8])0x0;
                      points = (stbtt__point *)0x0;
                      local_3f8 = pvVar62;
                      do {
                        auVar114 = local_478;
                        local_478._4_4_ = 0;
                        local_478._0_4_ = uVar95;
                        uVar83 = local_478._0_8_;
                        local_478 = auVar114;
                        if (uVar95 == 0) {
LAB_00131241:
                          local_288[0].data =
                               (uchar *)((ulong)local_288[0].data & 0xffffffff00000000);
                          if ((int)uVar60 < 1) {
                            lVar72 = -1;
                          }
                          else {
                            local_4b8 = auVar91;
                            local_478 = CONCAT88(local_478._8_8_,uVar83);
                            fVar113 = 0.0;
                            fVar100 = 0.0;
                            uVar95 = 0xffffffff;
                            lVar72 = 0;
                            do {
                              puVar66 = local_288[0].data;
                              switch(*(undefined1 *)(lVar90 + 0xc + lVar72)) {
                              case 1:
                                if (-1 < (int)uVar95) {
                                  *(int *)((long)local_3f8 + (ulong)uVar95 * 4) =
                                       (int)local_288[0].data - local_4b8._0_4_;
                                }
                                uVar95 = uVar95 + 1;
                                auVar114 = pshuflw(ZEXT416(*(uint *)(lVar90 + lVar72)),
                                                   ZEXT416(*(uint *)(lVar90 + lVar72)),0x60);
                                iVar61 = auVar114._0_4_;
                                iVar92 = auVar114._4_4_;
                                local_4b8 = (undefined1  [8])((ulong)local_288[0].data & 0xffffffff)
                                ;
                                break;
                              case 2:
                                auVar114 = pshuflw(ZEXT416(*(uint *)(lVar90 + lVar72)),
                                                   ZEXT416(*(uint *)(lVar90 + lVar72)),0x60);
                                iVar61 = auVar114._0_4_;
                                iVar92 = auVar114._4_4_;
                                break;
                              case 3:
                                stbtt__tesselate_curve
                                          (points,(int *)local_288,fVar113,fVar100,
                                           (float)(int)*(short *)(lVar90 + 4 + lVar72),
                                           (float)(int)*(short *)(lVar90 + 6 + lVar72),
                                           (float)(int)*(short *)(lVar90 + lVar72),
                                           (float)(int)*(short *)(lVar90 + 2 + lVar72),local_3d0,0);
                                goto LAB_001313b2;
                              case 4:
                                stbtt__tesselate_cubic
                                          (points,(int *)local_288,fVar113,fVar100,
                                           (float)(int)*(short *)(lVar90 + 4 + lVar72),
                                           (float)(int)*(short *)(lVar90 + 6 + lVar72),
                                           (float)(int)*(short *)(lVar90 + 8 + lVar72),
                                           (float)(int)*(short *)(lVar90 + 10 + lVar72),
                                           (float)(int)*(short *)(lVar90 + lVar72),
                                           (float)(int)*(short *)(lVar90 + 2 + lVar72),local_3d0,0);
LAB_001313b2:
                                auVar114 = pshuflw(ZEXT416(*(uint *)(lVar90 + lVar72)),
                                                   ZEXT416(*(uint *)(lVar90 + lVar72)),0x60);
                                fVar113 = (float)(auVar114._0_4_ >> 0x10);
                                fVar100 = (float)(auVar114._4_4_ >> 0x10);
                                puVar66 = local_288[0].data;
                              default:
                                goto switchD_0013128b_default;
                              }
                              puVar66 = (uchar *)CONCAT44(local_288[0].data._4_4_,
                                                          (int)local_288[0].data + 1);
                              fVar100 = (float)(iVar92 >> 0x10);
                              fVar113 = (float)(iVar61 >> 0x10);
                              if (points != (stbtt__point *)0x0) {
                                points[(int)local_288[0].data].x = fVar113;
                                points[(int)local_288[0].data].y = fVar100;
                              }
switchD_0013128b_default:
                              local_288[0].data = puVar66;
                              lVar72 = lVar72 + 0xe;
                            } while ((ulong)uVar60 * 0xe != lVar72);
                            lVar72 = (long)(int)uVar95;
                            uVar95 = local_478._0_4_;
                            auVar91 = local_4b8;
                          }
                          *(int *)((long)local_3f8 + lVar72 * 4) =
                               (int)local_288[0].data - SUB84(auVar91,0);
                          bVar97 = true;
                          uVar121 = uVar95;
                        }
                        else {
                          points = (stbtt__point *)
                                   ImGui::MemAlloc((long)(int)local_288[0].data << 3);
                          if (points != (stbtt__point *)0x0) goto LAB_00131241;
                          points = (stbtt__point *)0x0;
                          bVar97 = false;
                          uVar121 = uVar95;
                        }
                        if (!bVar97) {
                          ImGui::MemFree(points);
                          ImGui::MemFree(local_3f8);
                          uVar63 = 0;
                          goto LAB_00131472;
                        }
                        uVar95 = uVar121 + 1;
                        pvVar62 = local_3f8;
                      } while (uVar121 == 0);
                    }
                    local_3b0 = points;
                    if (points != (stbtt__point *)0x0) {
                      if ((int)uVar63 < 1) {
                        size = 0x14;
                      }
                      else {
                        uVar83 = 0;
                        lVar90 = 0;
                        do {
                          lVar90 = (long)(int)lVar90 + (long)*(int *)((long)pvVar62 + uVar83 * 4);
                          uVar83 = uVar83 + 1;
                        } while (uVar63 != uVar83);
                        size = lVar90 * 0x14 + 0x14;
                      }
                      psVar67 = (stbtt__edge *)ImGui::MemAlloc(size);
                      if (psVar67 != (stbtt__edge *)0x0) {
                        if ((int)uVar63 < 1) {
                          uVar60 = 0;
                        }
                        else {
                          uVar83 = 0;
                          uVar60 = 0;
                          iVar61 = 0;
                          do {
                            iVar92 = *(int *)((long)pvVar62 + uVar83 * 4);
                            if (0 < iVar92) {
                              uVar79 = (ulong)(iVar92 - 1);
                              uVar85 = 0;
                              do {
                                iVar89 = (int)uVar79;
                                fVar113 = local_3b0[(long)iVar61 + (long)iVar89].y;
                                fVar100 = local_3b0[(long)iVar61 + uVar85].y;
                                if ((fVar113 != fVar100) || (NAN(fVar113) || NAN(fVar100))) {
                                  iVar88 = (int)uVar85;
                                  iVar71 = iVar89;
                                  if (fVar113 <= fVar100) {
                                    iVar71 = iVar88;
                                    iVar88 = iVar89;
                                  }
                                  psVar67[(int)uVar60].invert = (uint)(fVar100 < fVar113);
                                  sVar5 = local_3b0[(long)iVar61 + (long)iVar71];
                                  sVar6 = local_3b0[(long)iVar61 + (long)iVar88];
                                  psVar84 = psVar67 + (int)uVar60;
                                  psVar84->x0 = sVar5.x * local_78 + 0.0;
                                  psVar84->y0 = sVar5.y * fStack_74 + 0.0;
                                  psVar84->x1 = sVar6.x * fStack_70 + 0.0;
                                  psVar84->y1 = sVar6.y * fStack_6c + 0.0;
                                  uVar60 = uVar60 + 1;
                                }
                                uVar79 = uVar85 & 0xffffffff;
                                uVar85 = uVar85 + 1;
                              } while ((long)uVar85 < (long)*(int *)((long)pvVar62 + uVar83 * 4));
                            }
                            iVar61 = iVar61 + iVar92;
                            uVar83 = uVar83 + 1;
                          } while (uVar83 != uVar63);
                        }
                        iVar61 = (int)local_468;
                        local_330 = psVar67;
                        stbtt__sort_edges_quicksort(psVar67,uVar60);
                        if (1 < (int)uVar60) {
                          uVar63 = 1;
                          do {
                            uVar2 = psVar67[uVar63].x0;
                            uVar7 = psVar67[uVar63].y0;
                            iVar92 = psVar67[uVar63].invert;
                            local_288[0].cursor = iVar92;
                            local_288[0].data = *(uchar **)&psVar67[uVar63].x1;
                            uVar83 = uVar63 & 0xffffffff;
                            do {
                              uVar95 = (uint)uVar83;
                              if ((int)uVar95 < 1) break;
                              fVar113 = psVar67[uVar83 - 1].y0;
                              if ((float)uVar7 < fVar113) {
                                psVar84 = psVar67 + uVar83;
                                psVar84->invert = psVar84[-1].invert;
                                fVar100 = psVar84[-1].y0;
                                fVar140 = psVar84[-1].x1;
                                fVar141 = psVar84[-1].y1;
                                psVar84->x0 = psVar84[-1].x0;
                                psVar84->y0 = fVar100;
                                psVar84->x1 = fVar140;
                                psVar84->y1 = fVar141;
                                uVar83 = (ulong)(uVar95 - 1);
                              }
                              uVar95 = (uint)uVar83;
                            } while ((float)uVar7 < fVar113);
                            if (uVar63 != uVar95) {
                              psVar67[(int)uVar95].x0 = (float)uVar2;
                              psVar67[(int)uVar95].y0 = (float)uVar7;
                              *(uchar **)&psVar67[(int)uVar95].x1 = local_288[0].data;
                              psVar67[(int)uVar95].invert = iVar92;
                            }
                            uVar63 = uVar63 + 1;
                          } while (uVar63 != uVar60);
                        }
                        uVar95 = (int)local_3f0 - iVar61;
                        local_3f0 = (ulong)uVar95;
                        local_488._0_8_ = (stbtt__active_edge *)0x0;
                        scanline = local_288;
                        if (0x3f < (int)uVar95) {
                          scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_3fc * 8 + 4);
                        }
                        uVar95 = (int)local_3c8 - (int)local_3d8;
                        local_3c8 = (ulong)uVar95;
                        psVar67[(int)uVar60].y0 = (float)(local_3e8._0_4_ + local_404) + 1.0;
                        local_3f8 = pvVar62;
                        if (uVar95 < 0x7fffffff) {
                          local_3a8 = local_3c0 + (long)local_3a8 * local_460 + local_458._0_8_;
                          local_374 = (float)(int)sVar54;
                          local_2e0 = (long)(int)local_3fc;
                          local_390 = (float *)((long)&scanline->data + local_2e0 * 4);
                          local_348 = local_390 + 1;
                          local_2d0 = local_2e0 * 4;
                          local_400 = (float)(int)local_3fc;
                          local_2d8 = (long)(int)(uint)local_3f0 * 4 + 8;
                          local_3a0 = 0;
                          local_398 = 0;
                          ptr_00 = (undefined8 *)0x0;
                          local_3cc = 0;
                          psVar94 = (stbtt__active_edge *)0x0;
                          local_378 = local_404;
                          do {
                            fVar100 = (float)local_378;
                            fVar113 = fVar100 + 1.0;
                            memset(scanline,0,local_2d0);
                            memset(local_390,0,local_2d8);
                            if ((stbtt__active_edge *)local_488._0_8_ != (stbtt__active_edge *)0x0)
                            {
                              psVar68 = (stbtt__active_edge *)local_488._0_8_;
                              psVar76 = (stbtt__active_edge *)local_488;
                              do {
                                psVar77 = psVar68;
                                if (psVar68->ey <= fVar100) {
                                  psVar76->next = psVar68->next;
                                  psVar68->direction = 0.0;
                                  psVar68->next = psVar94;
                                  psVar77 = psVar76;
                                  psVar94 = psVar68;
                                }
                                psVar68 = psVar77->next;
                                psVar76 = psVar77;
                              } while (psVar68 != (stbtt__active_edge *)0x0);
                            }
                            fVar140 = psVar67->y0;
                            if (fVar140 <= fVar113) {
                              bVar97 = local_404 != 0;
                              bVar98 = (int)local_398 == 0;
                              do {
                                if ((fVar140 != psVar67->y1) || (NAN(fVar140) || NAN(psVar67->y1)))
                                {
                                  if (psVar94 == (stbtt__active_edge *)0x0) {
                                    puVar70 = ptr_00;
                                    psVar68 = psVar94;
                                    if (local_3cc == 0) {
                                      puVar70 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                      if (puVar70 == (undefined8 *)0x0) {
                                        psVar76 = (stbtt__active_edge *)0x0;
                                        goto LAB_00131f27;
                                      }
                                      *puVar70 = ptr_00;
                                      local_3cc = 800;
                                    }
                                    lVar90 = (long)local_3cc;
                                    local_3cc = local_3cc + -1;
                                    psVar76 = (stbtt__active_edge *)(puVar70 + lVar90 * 4 + -3);
                                    ptr_00 = puVar70;
                                  }
                                  else {
                                    psVar68 = psVar94->next;
                                    psVar76 = psVar94;
                                  }
LAB_00131f27:
                                  psVar94 = psVar68;
                                  if (psVar76 != (stbtt__active_edge *)0x0) {
                                    uVar3 = psVar67->x0;
                                    uVar8 = psVar67->y0;
                                    uVar4 = psVar67->x1;
                                    uVar9 = psVar67->y1;
                                    fVar140 = ((float)uVar4 - (float)uVar3) /
                                              ((float)uVar9 - (float)uVar8);
                                    psVar76->fdx = fVar140;
                                    psVar76->fdy = (float)(-(uint)(fVar140 != 0.0) &
                                                          (uint)(1.0 / fVar140));
                                    psVar76->fx = ((fVar100 - (float)uVar8) * fVar140 + (float)uVar3
                                                  ) - local_374;
                                    psVar76->direction =
                                         *(float *)(&DAT_0017d830 +
                                                   (ulong)(psVar67->invert == 0) * 4);
                                    psVar76->sy = (float)uVar8;
                                    psVar76->ey = (float)uVar9;
                                    psVar76->next = (stbtt__active_edge *)0x0;
                                    if ((float)uVar9 < fVar100 && (bVar98 && bVar97)) {
                                      psVar76->ey = fVar100;
                                    }
                                    psVar76->next = (stbtt__active_edge *)local_488._0_8_;
                                    local_488._0_8_ = psVar76;
                                  }
                                }
                                fVar140 = psVar67[1].y0;
                                psVar67 = psVar67 + 1;
                              } while (fVar140 <= fVar113);
                            }
                            local_2c8 = ptr_00;
                            ptr_00 = local_2c8;
                            iVar61 = local_378;
                            fVar140 = local_318;
                            for (psVar68 = (stbtt__active_edge *)local_488._0_8_;
                                local_318 = fVar140, local_2c8 = ptr_00,
                                psVar68 != (stbtt__active_edge *)0x0; psVar68 = psVar68->next) {
                              local_318 = psVar68->fx;
                              fVar141 = psVar68->fdx;
                              local_378 = iVar61;
                              if ((fVar141 != 0.0) || (NAN(fVar141))) {
                                fVar146 = fVar141 + local_318;
                                fVar142 = psVar68->sy;
                                fVar143 = (float)(~-(uint)(fVar100 < fVar142) & (uint)local_318 |
                                                 (uint)((fVar142 - fVar100) * fVar141 + local_318) &
                                                 -(uint)(fVar100 < fVar142));
                                if (0.0 <= fVar143) {
                                  fVar147 = psVar68->ey;
                                  fVar148 = (float)(-(uint)(fVar147 < fVar113) &
                                                    (uint)((fVar147 - fVar100) * fVar141 + local_318
                                                          ) |
                                                   ~-(uint)(fVar147 < fVar113) & (uint)fVar146);
                                  if (((0.0 <= fVar148) && (fVar143 < local_400)) &&
                                     (fVar148 < local_400)) {
                                    if (fVar142 <= fVar100) {
                                      fVar142 = fVar100;
                                    }
                                    iVar61 = (int)fVar143;
                                    if (fVar113 <= fVar147) {
                                      fVar147 = fVar113;
                                    }
                                    if (iVar61 == (int)fVar148) {
                                      lVar90 = (long)iVar61;
                                      *(float *)((long)&scanline->data + lVar90 * 4) =
                                           (((fVar148 - (float)iVar61) + (fVar143 - (float)iVar61))
                                            * -0.5 + 1.0) * psVar68->direction * (fVar147 - fVar142)
                                           + *(float *)((long)&scanline->data + lVar90 * 4);
                                      fVar146 = (fVar147 - fVar142) * psVar68->direction;
                                    }
                                    else {
                                      fVar141 = psVar68->fdy;
                                      fVar149 = fVar148;
                                      if (fVar148 < fVar143) {
                                        fVar157 = fVar100 - fVar142;
                                        fVar142 = (fVar100 - fVar147) + fVar113;
                                        fVar141 = -fVar141;
                                        local_318 = fVar146;
                                        fVar149 = fVar143;
                                        fVar147 = fVar157 + fVar113;
                                        fVar143 = fVar148;
                                      }
                                      iVar92 = (int)fVar149;
                                      iVar61 = (int)fVar143 + 1;
                                      fVar157 = ((float)iVar61 - local_318) * fVar141 + fVar100;
                                      fVar146 = psVar68->direction;
                                      fVar148 = (fVar157 - fVar142) * fVar146;
                                      lVar90 = (long)(int)fVar143;
                                      *(float *)((long)&scanline->data + lVar90 * 4) =
                                           (((fVar143 - (float)(int)fVar143) + 1.0) * -0.5 + 1.0) *
                                           fVar148 + *(float *)((long)&scanline->data + lVar90 * 4);
                                      if (iVar92 - iVar61 != 0 && iVar61 <= iVar92) {
                                        do {
                                          *(float *)((long)&scanline->data + lVar90 * 4 + 4) =
                                               fVar141 * fVar146 * 0.5 + fVar148 +
                                               *(float *)((long)&scanline->data + lVar90 * 4 + 4);
                                          fVar148 = fVar148 + fVar141 * fVar146;
                                          lVar90 = lVar90 + 1;
                                        } while (iVar92 + -1 != (int)lVar90);
                                      }
                                      lVar90 = (long)iVar92;
                                      *(float *)((long)&scanline->data + lVar90 * 4) =
                                           (fVar147 - (fVar141 * (float)(iVar92 - iVar61) + fVar157)
                                           ) * (((fVar149 - (float)iVar92) + 0.0) * -0.5 + 1.0) *
                                               fVar146 + fVar148 +
                                           *(float *)((long)&scanline->data + lVar90 * 4);
                                      fVar146 = (fVar147 - fVar142) * fVar146;
                                    }
                                    local_348[lVar90] = fVar146 + local_348[lVar90];
                                    goto LAB_00131db5;
                                  }
                                }
                                if ((uint)local_3f0 < 0x7fffffff) {
                                  uStack_314 = 0;
                                  uStack_310 = 0;
                                  uStack_30c = 0;
                                  fVar142 = fVar100;
                                  local_3e8 = ZEXT416((uint)fVar146);
                                  local_370 = fVar141;
                                  uVar60 = 0;
                                  do {
                                    fVar141 = (float)(int)uVar60;
                                    uVar95 = uVar60 + 1;
                                    fVar146 = (float)(int)uVar95;
                                    fVar140 = (fVar141 - local_318) / local_370 + fVar142;
                                    fVar143 = (fVar146 - local_318) / local_370 + fVar142;
                                    local_4b8._0_4_ = fVar140;
                                    local_478._0_4_ = fVar141;
                                    fVar147 = local_3e8._0_4_;
                                    fVar100 = fVar142;
                                    if ((fVar141 <= local_318) || (fVar147 <= fVar146)) {
                                      if ((fVar141 <= fVar147) || (local_318 <= fVar146)) {
                                        fVar148 = local_318;
                                        if (((fVar141 <= local_318) || (fVar147 <= fVar141)) &&
                                           ((fVar141 <= fVar147 || (local_318 <= fVar141)))) {
                                          if (((local_318 < fVar146) && (fVar146 < fVar147)) ||
                                             ((fVar141 = local_318, fVar140 = fVar142,
                                              fVar147 < fVar146 && (fVar146 < local_318)))) {
                                            local_458._0_4_ = fVar143;
                                            fVar141 = local_318;
                                            goto LAB_00131a9a;
                                          }
                                          goto LAB_00131b51;
                                        }
                                      }
                                      else {
                                        local_458._0_4_ = fVar143;
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar60,psVar68,local_318,
                                                   fVar142,fVar146,fVar143);
                                        fVar148 = fVar146;
                                        fVar141 = (float)local_478._0_4_;
                                        fVar142 = (float)local_458._0_4_;
                                      }
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar60,psVar68,fVar148,fVar142,
                                                 fVar141,fVar140);
                                      fVar141 = (float)local_478._0_4_;
                                    }
                                    else {
                                      local_458._0_4_ = fVar143;
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar60,psVar68,local_318,fVar142,
                                                 fVar141,fVar140);
                                      fVar141 = (float)local_478._0_4_;
                                      fVar143 = (float)local_458._0_4_;
                                      fVar142 = fVar140;
LAB_00131a9a:
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar60,psVar68,fVar141,fVar142,
                                                 fVar146,fVar143);
                                      fVar141 = fVar146;
                                      fVar140 = (float)local_458._0_4_;
                                    }
LAB_00131b51:
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar60,psVar68,fVar141,fVar140,
                                               local_3e8._0_4_,fVar113);
                                    fVar142 = fVar100;
                                    fVar140 = local_318;
                                    uVar60 = uVar95;
                                  } while (local_3fc != uVar95);
                                }
                              }
                              else if (local_318 < local_400) {
                                if (0.0 <= local_318) {
                                  iVar61 = (int)local_318;
                                  uStack_314 = 0;
                                  uStack_310 = 0;
                                  uStack_30c = 0;
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,iVar61,psVar68,local_318,fVar100,
                                             local_318,fVar113);
                                  iVar61 = iVar61 + 1;
                                  fVar141 = local_318;
                                }
                                else {
                                  iVar61 = 0;
                                  fVar141 = local_318;
                                  local_318 = fVar140;
                                }
                                stbtt__handle_clipped_edge
                                          (local_390,iVar61,psVar68,fVar141,fVar100,fVar141,fVar113)
                                ;
                                fVar140 = local_318;
                              }
LAB_00131db5:
                              local_318 = fVar140;
                              ptr_00 = local_2c8;
                              iVar61 = local_378;
                              fVar140 = local_318;
                            }
                            psVar68 = (stbtt__active_edge *)local_488._0_8_;
                            if ((uint)local_3f0 < 0x7fffffff) {
                              fVar113 = 0.0;
                              psVar69 = scanline;
                              uVar63 = local_3a0;
                              lVar90 = local_2e0;
                              do {
                                fVar113 = fVar113 + *(float *)((long)&psVar69->data + local_2e0 * 4)
                                ;
                                iVar92 = (int)(ABS(*(float *)&psVar69->data + fVar113) * 255.0 + 0.5
                                              );
                                uVar82 = (uchar)iVar92;
                                if (0xfe < iVar92) {
                                  uVar82 = 0xff;
                                }
                                local_3a8[(int)uVar63] = uVar82;
                                uVar63 = (ulong)((int)uVar63 + 1);
                                psVar69 = (stbtt__buf *)((long)&psVar69->data + 4);
                                lVar90 = lVar90 + -1;
                              } while (lVar90 != 0);
                            }
                            for (; psVar68 != (stbtt__active_edge *)0x0; psVar68 = psVar68->next) {
                              psVar68->fx = psVar68->fdx + psVar68->fx;
                            }
                            local_378 = iVar61 + 1;
                            iVar92 = (int)local_398;
                            local_398 = (ulong)(iVar92 + 1);
                            local_3a0 = (ulong)(uint)((int)local_3a0 + local_37c);
                            pvVar93 = local_3f8;
                            psVar84 = local_330;
                          } while (iVar92 != (int)local_3c8);
                        }
                        else {
                          ptr_00 = (undefined8 *)0x0;
                          pvVar93 = pvVar62;
                          iVar61 = local_378;
                          psVar84 = local_330;
                        }
                        while (local_378 = iVar61, psVar67 = local_330, pvVar62 = local_3f8,
                              local_3f8 = pvVar93, local_330 = psVar84, ptr_00 != (undefined8 *)0x0)
                        {
                          puVar70 = (undefined8 *)*ptr_00;
                          ImGui::MemFree(ptr_00);
                          ptr_00 = puVar70;
                          pvVar93 = local_3f8;
                          iVar61 = local_378;
                          psVar84 = local_330;
                          local_330 = psVar67;
                          local_3f8 = pvVar62;
                        }
                        if (scanline != local_288) {
                          ImGui::MemFree(scanline);
                        }
                        ImGui::MemFree(psVar67);
                      }
                      ImGui::MemFree(pvVar62);
                      ImGui::MemFree(local_3b0);
                    }
                  }
                }
                ImGui::MemFree((void *)CONCAT44(local_410._4_4_,(stbtt_uint32)local_410));
                auVar114 = _DAT_0017d760;
                if (1 < (byte)local_338) {
                  uVar52 = *(ushort *)(local_3b8 + 4);
                  local_288[0].data = (uchar *)0x0;
                  uVar60 = CONCAT22(0,*(ushort *)(local_3b8 + 6));
                  local_4b8._0_4_ = uVar60;
                  if (uVar60 != 0) {
                    puVar66 = local_3c0 +
                              (ulong)*(ushort *)(local_3b8 + 10) * local_460 +
                              (ulong)*(ushort *)(local_3b8 + 8);
                    iVar61 = (uint)uVar52 - (int)local_468;
                    uVar63 = (ulong)(iVar61 + 1);
                    uVar95 = 0;
                    do {
                      uVar83 = local_338;
                      memset(local_288,0,local_338);
                      auVar114 = _DAT_0017d760;
                      switch((int)uVar83) {
                      case 2:
                        if (iVar61 < 0) {
LAB_001322ea:
                          uVar85 = 0;
                          uVar83 = 0;
                        }
                        else {
                          uVar85 = 0;
                          uVar83 = 0;
                          do {
                            bVar99 = puVar66[uVar85];
                            bVar107 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 & 7)
                                               );
                            *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 + 2 & 7)) =
                                 bVar99;
                            uVar121 = (int)uVar83 + ((uint)bVar99 - (uint)bVar107);
                            uVar83 = (ulong)uVar121;
                            puVar66[uVar85] = (uchar)(uVar121 >> 1);
                            uVar85 = uVar85 + 1;
                          } while (uVar63 != uVar85);
                        }
                        break;
                      case 3:
                        if (iVar61 < 0) goto LAB_001322ea;
                        uVar85 = 0;
                        uVar83 = 0;
                        do {
                          bVar99 = puVar66[uVar85];
                          bVar107 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 + 3 & 7)) =
                               bVar99;
                          uVar83 = (ulong)((int)uVar83 + ((uint)bVar99 - (uint)bVar107));
                          puVar66[uVar85] = (uchar)(uVar83 / 3);
                          uVar85 = uVar85 + 1;
                        } while (uVar63 != uVar85);
                        break;
                      case 4:
                        if (iVar61 < 0) goto LAB_001322ea;
                        uVar85 = 0;
                        uVar83 = 0;
                        do {
                          bVar99 = puVar66[uVar85];
                          uVar79 = (ulong)((uint)uVar85 & 7);
                          bVar107 = *(byte *)((long)&local_288[0].data + uVar79);
                          *(byte *)((long)&local_288[0].data + (uVar79 ^ 4)) = bVar99;
                          uVar121 = (int)uVar83 + ((uint)bVar99 - (uint)bVar107);
                          uVar83 = (ulong)uVar121;
                          puVar66[uVar85] = (uchar)(uVar121 >> 2);
                          uVar85 = uVar85 + 1;
                        } while (uVar63 != uVar85);
                        break;
                      case 5:
                        if (iVar61 < 0) goto LAB_001322ea;
                        uVar85 = 0;
                        uVar83 = 0;
                        do {
                          bVar99 = puVar66[uVar85];
                          bVar107 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 + 5 & 7)) =
                               bVar99;
                          uVar83 = (ulong)((int)uVar83 + ((uint)bVar99 - (uint)bVar107));
                          puVar66[uVar85] = (uchar)(uVar83 / 5);
                          uVar85 = uVar85 + 1;
                        } while (uVar63 != uVar85);
                        break;
                      default:
                        uVar85 = 0;
                        uVar83 = 0;
                        if (-1 < iVar61) {
                          do {
                            bVar99 = puVar66[uVar85];
                            bVar107 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 & 7)
                                               );
                            *(byte *)((long)&local_288[0].data +
                                     (ulong)((int)local_468 + (uint)uVar85 & 7)) = bVar99;
                            uVar83 = (ulong)((int)uVar83 + ((uint)bVar99 - (uint)bVar107));
                            puVar66[uVar85] = (uchar)(uVar83 / (local_468 & 0xffffffff));
                            uVar85 = uVar85 + 1;
                          } while (uVar63 != uVar85);
                        }
                      }
                      if ((int)uVar85 < (int)(uint)uVar52) {
                        uVar85 = uVar85 & 0xffffffff;
                        do {
                          uVar83 = (ulong)((int)uVar83 -
                                          (uint)*(byte *)((long)&local_288[0].data +
                                                         (ulong)((uint)uVar85 & 7)));
                          puVar66[uVar85] = (uchar)(uVar83 / (local_468 & 0xffffffff));
                          uVar85 = uVar85 + 1;
                        } while ((int)uVar85 < (int)(uint)uVar52);
                      }
                      puVar66 = puVar66 + local_460;
                      uVar95 = uVar95 + 1;
                    } while (uVar95 != uVar60);
                  }
                }
                if (1 < (byte)local_340) {
                  uVar52 = *(ushort *)(local_3b8 + 6);
                  local_288[0].data = (uchar *)0x0;
                  uVar60 = CONCAT22(0,*(ushort *)(local_3b8 + 4));
                  local_4b8._0_4_ = uVar60;
                  if (uVar60 != 0) {
                    pbVar81 = local_3c0 +
                              (ulong)*(ushort *)(local_3b8 + 10) * local_460 +
                              (ulong)*(ushort *)(local_3b8 + 8);
                    local_478._0_4_ = (uint)uVar52 - (int)local_3d8;
                    uVar63 = (ulong)((uint)uVar52 + (int)local_358 + 1);
                    uVar95 = 0;
                    do {
                      uVar83 = local_340;
                      memset(local_288,0,local_340);
                      auVar114 = _DAT_0017d760;
                      switch((int)uVar83) {
                      case 2:
                        if ((int)local_478._0_4_ < 0) {
LAB_00132614:
                          uVar85 = 0;
                          uVar83 = 0;
                        }
                        else {
                          uVar85 = 0;
                          uVar83 = 0;
                          pbVar86 = pbVar81;
                          do {
                            bVar99 = *pbVar86;
                            bVar107 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 & 7)
                                               );
                            *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 + 2 & 7)) =
                                 bVar99;
                            uVar121 = (int)uVar83 + ((uint)bVar99 - (uint)bVar107);
                            uVar83 = (ulong)uVar121;
                            *pbVar86 = (byte)(uVar121 >> 1);
                            uVar85 = uVar85 + 1;
                            pbVar86 = pbVar86 + local_460;
                          } while (uVar63 != uVar85);
                        }
                        break;
                      case 3:
                        if ((int)local_478._0_4_ < 0) goto LAB_00132614;
                        uVar85 = 0;
                        uVar83 = 0;
                        pbVar86 = pbVar81;
                        do {
                          bVar99 = *pbVar86;
                          bVar107 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 + 3 & 7)) =
                               bVar99;
                          uVar83 = (ulong)((int)uVar83 + ((uint)bVar99 - (uint)bVar107));
                          *pbVar86 = (byte)(uVar83 / 3);
                          uVar85 = uVar85 + 1;
                          pbVar86 = pbVar86 + local_460;
                        } while (uVar63 != uVar85);
                        break;
                      case 4:
                        if ((int)local_478._0_4_ < 0) goto LAB_00132614;
                        uVar85 = 0;
                        uVar83 = 0;
                        pbVar86 = pbVar81;
                        do {
                          bVar99 = *pbVar86;
                          uVar79 = (ulong)((uint)uVar85 & 7);
                          bVar107 = *(byte *)((long)&local_288[0].data + uVar79);
                          *(byte *)((long)&local_288[0].data + (uVar79 ^ 4)) = bVar99;
                          uVar121 = (int)uVar83 + ((uint)bVar99 - (uint)bVar107);
                          uVar83 = (ulong)uVar121;
                          *pbVar86 = (byte)(uVar121 >> 2);
                          uVar85 = uVar85 + 1;
                          pbVar86 = pbVar86 + local_460;
                        } while (uVar63 != uVar85);
                        break;
                      case 5:
                        if ((int)local_478._0_4_ < 0) goto LAB_00132614;
                        uVar85 = 0;
                        uVar83 = 0;
                        pbVar86 = pbVar81;
                        do {
                          bVar99 = *pbVar86;
                          bVar107 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 + 5 & 7)) =
                               bVar99;
                          uVar83 = (ulong)((int)uVar83 + ((uint)bVar99 - (uint)bVar107));
                          *pbVar86 = (byte)(uVar83 / 5);
                          uVar85 = uVar85 + 1;
                          pbVar86 = pbVar86 + local_460;
                        } while (uVar63 != uVar85);
                        break;
                      default:
                        if ((int)local_478._0_4_ < 0) {
                          uVar85 = 0;
                          uVar83 = 0;
                        }
                        else {
                          uVar85 = 0;
                          uVar83 = 0;
                          pbVar86 = pbVar81;
                          do {
                            bVar99 = *pbVar86;
                            bVar107 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar85 & 7)
                                               );
                            *(byte *)((long)&local_288[0].data +
                                     (ulong)((int)local_3d8 + (uint)uVar85 & 7)) = bVar99;
                            uVar83 = (ulong)((int)uVar83 + ((uint)bVar99 - (uint)bVar107));
                            *pbVar86 = (byte)(uVar83 / (local_3d8 & 0xffffffff));
                            uVar85 = uVar85 + 1;
                            pbVar86 = pbVar86 + local_460;
                          } while (uVar63 != uVar85);
                        }
                      }
                      if ((int)uVar85 < (int)(uint)uVar52) {
                        uVar85 = (ulong)(int)uVar85;
                        pbVar86 = pbVar81 + local_460 * uVar85;
                        do {
                          uVar83 = (ulong)((int)uVar83 -
                                          (uint)*(byte *)((long)&local_288[0].data +
                                                         (ulong)((uint)uVar85 & 7)));
                          *pbVar86 = (byte)(uVar83 / (local_3d8 & 0xffffffff));
                          uVar85 = uVar85 + 1;
                          pbVar86 = pbVar86 + local_460;
                        } while (uVar52 != uVar85);
                      }
                      pbVar81 = pbVar81 + 1;
                      uVar95 = uVar95 + 1;
                    } while (uVar95 != uVar60);
                  }
                }
                local_2f0[4] = (float)(int)(short)((short)(local_380 << 8) + (short)local_384) *
                               local_328;
                *(ulong *)(local_2f0 + 2) =
                     CONCAT44((float)local_36c * (float)local_58._4_4_ + (float)local_48._4_4_,
                              (float)local_368 * (float)local_58._0_4_ + (float)local_48._0_4_);
                uVar150 = *(undefined4 *)(local_3b8 + 8);
                *local_2f0 = uVar150;
                uVar60 = *(uint *)(local_3b8 + 4);
                uVar52 = (ushort)(uVar60 >> 0x10);
                local_2f0[1] = CONCAT22((short)((uint)uVar150 >> 0x10) + uVar52,
                                        (short)uVar150 + (short)uVar60);
                local_2f0[5] = (float)(int)((uVar60 & 0xffff) + local_368) * (float)local_58._0_4_ +
                               (float)local_48._0_4_;
                local_2f0[6] = (float)(int)((uint)uVar52 + local_36c) * (float)local_58._4_4_ +
                               (float)local_48._4_4_;
                lVar90 = local_2f8;
                lVar72 = local_2e8;
                psVar80 = local_350;
                auVar116 = _DAT_0017a2b0;
              }
            }
            lVar72 = lVar72 + 1;
          } while (lVar72 < psVar80[1].fontstart);
        }
        fVar113 = local_308[local_300].RasterizerMultiply;
        _local_4b8 = ZEXT416((uint)fVar113);
        if ((fVar113 != 1.0) || (NAN(fVar113))) {
          local_4b8._4_4_ = fVar113;
          local_4b8._0_4_ = fVar113;
          fStack_4b0 = fVar113;
          fStack_4ac = fVar113;
          lVar90 = 0;
          uVar60 = 0;
          uVar95 = 1;
          uVar121 = 2;
          uVar123 = 3;
          uVar124 = 4;
          uVar126 = 5;
          uVar127 = 6;
          uVar128 = 7;
          uVar129 = 8;
          uVar130 = 9;
          uVar131 = 10;
          uVar132 = 0xb;
          uVar133 = 0xc;
          uVar135 = 0xd;
          uVar136 = 0xe;
          uVar137 = 0xf;
          do {
            fVar160 = (((float)(uVar129 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar129 & 0xffff | 0x4b000000)) * fVar113;
            fVar165 = (((float)(uVar130 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar130 & 0xffff | 0x4b000000)) * fVar113;
            fVar166 = (((float)(uVar131 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar131 & 0xffff | 0x4b000000)) * fVar113;
            fVar167 = (((float)(uVar132 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar132 & 0xffff | 0x4b000000)) * fVar113;
            fVar149 = (((float)(uVar133 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar133 & 0xffff | 0x4b000000)) * fVar113;
            fVar157 = (((float)(uVar135 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar135 & 0xffff | 0x4b000000)) * fVar113;
            fVar158 = (((float)(uVar136 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar136 & 0xffff | 0x4b000000)) * fVar113;
            fVar159 = (((float)(uVar137 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar137 & 0xffff | 0x4b000000)) * fVar113;
            fVar143 = (((float)(uVar60 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar60 & 0xffff | 0x4b000000)) * fVar113;
            fVar146 = (((float)(uVar95 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar95 & 0xffff | 0x4b000000)) * fVar113;
            fVar147 = (((float)(uVar121 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar121 & 0xffff | 0x4b000000)) * fVar113;
            fVar148 = (((float)(uVar123 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar123 & 0xffff | 0x4b000000)) * fVar113;
            fVar100 = (((float)(uVar124 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar124 & 0xffff | 0x4b000000)) * fVar113;
            fVar140 = (((float)(uVar126 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar126 & 0xffff | 0x4b000000)) * fVar113;
            fVar141 = (((float)(uVar127 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar127 & 0xffff | 0x4b000000)) * fVar113;
            fVar142 = (((float)(uVar128 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar128 & 0xffff | 0x4b000000)) * fVar113;
            auVar139._0_4_ = (int)fVar100;
            auVar139._4_4_ = (int)fVar140;
            auVar139._8_4_ = (int)fVar141;
            auVar139._12_4_ = (int)fVar142;
            auVar178._0_4_ = auVar139._0_4_ >> 0x1f;
            auVar178._4_4_ = auVar139._4_4_ >> 0x1f;
            auVar178._8_4_ = auVar139._8_4_ >> 0x1f;
            auVar178._12_4_ = auVar139._12_4_ >> 0x1f;
            auVar138._0_4_ = (int)(fVar100 - 2.1474836e+09);
            auVar138._4_4_ = (int)(fVar140 - 2.1474836e+09);
            auVar138._8_4_ = (int)(fVar141 - 2.1474836e+09);
            auVar138._12_4_ = (int)(fVar142 - 2.1474836e+09);
            auVar139 = auVar138 & auVar178 | auVar139;
            auVar145._0_4_ = (int)fVar143;
            auVar145._4_4_ = (int)fVar146;
            auVar145._8_4_ = (int)fVar147;
            auVar145._12_4_ = (int)fVar148;
            auVar179._0_4_ = auVar145._0_4_ >> 0x1f;
            auVar179._4_4_ = auVar145._4_4_ >> 0x1f;
            auVar179._8_4_ = auVar145._8_4_ >> 0x1f;
            auVar179._12_4_ = auVar145._12_4_ >> 0x1f;
            auVar144._0_4_ = (int)(fVar143 - 2.1474836e+09);
            auVar144._4_4_ = (int)(fVar146 - 2.1474836e+09);
            auVar144._8_4_ = (int)(fVar147 - 2.1474836e+09);
            auVar144._12_4_ = (int)(fVar148 - 2.1474836e+09);
            auVar145 = auVar144 & auVar179 | auVar145;
            auVar174._0_4_ = (int)fVar149;
            auVar174._4_4_ = (int)fVar157;
            auVar174._8_4_ = (int)fVar158;
            auVar174._12_4_ = (int)fVar159;
            auVar182._0_4_ = auVar174._0_4_ >> 0x1f;
            auVar182._4_4_ = auVar174._4_4_ >> 0x1f;
            auVar182._8_4_ = auVar174._8_4_ >> 0x1f;
            auVar182._12_4_ = auVar174._12_4_ >> 0x1f;
            auVar173._0_4_ = (int)(fVar149 - 2.1474836e+09);
            auVar173._4_4_ = (int)(fVar157 - 2.1474836e+09);
            auVar173._8_4_ = (int)(fVar158 - 2.1474836e+09);
            auVar173._12_4_ = (int)(fVar159 - 2.1474836e+09);
            auVar174 = auVar173 & auVar182 | auVar174;
            auVar162._0_4_ = (int)fVar160;
            auVar162._4_4_ = (int)fVar165;
            auVar162._8_4_ = (int)fVar166;
            auVar162._12_4_ = (int)fVar167;
            auVar180._0_4_ = auVar162._0_4_ >> 0x1f;
            auVar180._4_4_ = auVar162._4_4_ >> 0x1f;
            auVar180._8_4_ = auVar162._8_4_ >> 0x1f;
            auVar180._12_4_ = auVar162._12_4_ >> 0x1f;
            auVar161._0_4_ = (int)(fVar160 - 2.1474836e+09);
            auVar161._4_4_ = (int)(fVar165 - 2.1474836e+09);
            auVar161._8_4_ = (int)(fVar166 - 2.1474836e+09);
            auVar161._12_4_ = (int)(fVar167 - 2.1474836e+09);
            auVar162 = auVar161 & auVar180 | auVar162;
            auVar116 = auVar162 ^ _DAT_0017a2b0;
            auVar155._0_4_ = -(uint)(auVar116._0_4_ < -0x7fffff01);
            auVar155._4_4_ = -(uint)(auVar116._4_4_ < -0x7fffff01);
            auVar155._8_4_ = -(uint)(auVar116._8_4_ < -0x7fffff01);
            auVar155._12_4_ = -(uint)(auVar116._12_4_ < -0x7fffff01);
            auVar116 = ~auVar155 & auVar114 | auVar162 & auVar155;
            auVar163 = auVar174 ^ _DAT_0017a2b0;
            auVar181._0_4_ = -(uint)(auVar163._0_4_ < -0x7fffff01);
            auVar181._4_4_ = -(uint)(auVar163._4_4_ < -0x7fffff01);
            auVar181._8_4_ = -(uint)(auVar163._8_4_ < -0x7fffff01);
            auVar181._12_4_ = -(uint)(auVar163._12_4_ < -0x7fffff01);
            auVar163 = ~auVar181 & auVar114 | auVar174 & auVar181;
            sVar13 = auVar116._0_2_;
            cVar18 = (0 < sVar13) * (sVar13 < 0x100) * auVar116[0] - (0xff < sVar13);
            sVar13 = auVar116._2_2_;
            sVar53 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar116[2] - (0xff < sVar13),cVar18
                             );
            sVar13 = auVar116._4_2_;
            cVar108 = (0 < sVar13) * (sVar13 < 0x100) * auVar116[4] - (0xff < sVar13);
            sVar13 = auVar116._6_2_;
            uVar150 = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar116[6] - (0xff < sVar13),
                               CONCAT12(cVar108,sVar53));
            sVar13 = auVar116._8_2_;
            cVar19 = (0 < sVar13) * (sVar13 < 0x100) * auVar116[8] - (0xff < sVar13);
            sVar13 = auVar116._10_2_;
            uVar151 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar116[10] - (0xff < sVar13),
                               CONCAT14(cVar19,uVar150));
            sVar13 = auVar116._12_2_;
            cVar20 = (0 < sVar13) * (sVar13 < 0x100) * auVar116[0xc] - (0xff < sVar13);
            sVar13 = auVar116._14_2_;
            uVar152 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar116[0xe] - (0xff < sVar13),
                               CONCAT16(cVar20,uVar151));
            sVar13 = auVar163._0_2_;
            cVar21 = (0 < sVar13) * (sVar13 < 0x100) * auVar163[0] - (0xff < sVar13);
            sVar13 = auVar163._2_2_;
            auVar153._0_10_ =
                 CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar163[2] - (0xff < sVar13),
                          CONCAT18(cVar21,uVar152));
            sVar13 = auVar163._4_2_;
            cVar22 = (0 < sVar13) * (sVar13 < 0x100) * auVar163[4] - (0xff < sVar13);
            auVar153[10] = cVar22;
            sVar13 = auVar163._6_2_;
            auVar153[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar163[6] - (0xff < sVar13);
            sVar13 = auVar163._8_2_;
            cVar23 = (0 < sVar13) * (sVar13 < 0x100) * auVar163[8] - (0xff < sVar13);
            auVar154[0xc] = cVar23;
            auVar154._0_12_ = auVar153;
            sVar13 = auVar163._10_2_;
            auVar154[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar163[10] - (0xff < sVar13);
            sVar13 = auVar163._12_2_;
            cVar109 = (0 < sVar13) * (sVar13 < 0x100) * auVar163[0xc] - (0xff < sVar13);
            auVar156[0xe] = cVar109;
            auVar156._0_14_ = auVar154;
            sVar13 = auVar163._14_2_;
            auVar156[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar163[0xe] - (0xff < sVar13);
            auVar116 = auVar145 ^ _DAT_0017a2b0;
            auVar175._0_4_ = -(uint)(auVar116._0_4_ < -0x7fffff01);
            auVar175._4_4_ = -(uint)(auVar116._4_4_ < -0x7fffff01);
            auVar175._8_4_ = -(uint)(auVar116._8_4_ < -0x7fffff01);
            auVar175._12_4_ = -(uint)(auVar116._12_4_ < -0x7fffff01);
            auVar163 = ~auVar175 & auVar114 | auVar145 & auVar175;
            auVar116 = auVar139 ^ _DAT_0017a2b0;
            auVar164._0_4_ = -(uint)(auVar116._0_4_ < -0x7fffff01);
            auVar164._4_4_ = -(uint)(auVar116._4_4_ < -0x7fffff01);
            auVar164._8_4_ = -(uint)(auVar116._8_4_ < -0x7fffff01);
            auVar164._12_4_ = -(uint)(auVar116._12_4_ < -0x7fffff01);
            auVar116 = ~auVar164 & auVar114 | auVar139 & auVar164;
            sVar13 = auVar163._0_2_;
            cVar24 = (0 < sVar13) * (sVar13 < 0x100) * auVar163[0] - (0xff < sVar13);
            sVar13 = auVar163._2_2_;
            sVar110 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar163[2] - (0xff < sVar13),
                               cVar24);
            sVar13 = auVar163._4_2_;
            cVar25 = (0 < sVar13) * (sVar13 < 0x100) * auVar163[4] - (0xff < sVar13);
            sVar13 = auVar163._6_2_;
            uVar168 = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar163[6] - (0xff < sVar13),
                               CONCAT12(cVar25,sVar110));
            sVar13 = auVar163._8_2_;
            cVar26 = (0 < sVar13) * (sVar13 < 0x100) * auVar163[8] - (0xff < sVar13);
            sVar13 = auVar163._10_2_;
            uVar169 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar163[10] - (0xff < sVar13),
                               CONCAT14(cVar26,uVar168));
            sVar13 = auVar163._12_2_;
            cVar27 = (0 < sVar13) * (sVar13 < 0x100) * auVar163[0xc] - (0xff < sVar13);
            sVar13 = auVar163._14_2_;
            uVar170 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar163[0xe] - (0xff < sVar13),
                               CONCAT16(cVar27,uVar169));
            sVar13 = auVar116._0_2_;
            cVar28 = (0 < sVar13) * (sVar13 < 0x100) * auVar116[0] - (0xff < sVar13);
            sVar13 = auVar116._2_2_;
            auVar171._0_10_ =
                 CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar116[2] - (0xff < sVar13),
                          CONCAT18(cVar28,uVar170));
            sVar13 = auVar116._4_2_;
            cVar29 = (0 < sVar13) * (sVar13 < 0x100) * auVar116[4] - (0xff < sVar13);
            auVar171[10] = cVar29;
            sVar13 = auVar116._6_2_;
            auVar171[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar116[6] - (0xff < sVar13);
            sVar13 = auVar116._8_2_;
            cVar30 = (0 < sVar13) * (sVar13 < 0x100) * auVar116[8] - (0xff < sVar13);
            auVar172[0xc] = cVar30;
            auVar172._0_12_ = auVar171;
            sVar13 = auVar116._10_2_;
            auVar172[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar116[10] - (0xff < sVar13);
            sVar13 = auVar116._12_2_;
            cVar31 = (0 < sVar13) * (sVar13 < 0x100) * auVar116[0xc] - (0xff < sVar13);
            auVar176[0xe] = cVar31;
            auVar176._0_14_ = auVar172;
            sVar13 = auVar116._14_2_;
            auVar176[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar116[0xe] - (0xff < sVar13);
            sVar13 = (short)((uint)uVar168 >> 0x10);
            auVar177[1] = (0 < sVar13) * (sVar13 < 0x100) * cVar25 - (0xff < sVar13);
            auVar177[0] = (0 < sVar110) * (sVar110 < 0x100) * cVar24 - (0xff < sVar110);
            sVar13 = (short)((uint6)uVar169 >> 0x20);
            auVar177[2] = (0 < sVar13) * (sVar13 < 0x100) * cVar26 - (0xff < sVar13);
            sVar13 = (short)((ulong)uVar170 >> 0x30);
            auVar177[3] = (0 < sVar13) * (sVar13 < 0x100) * cVar27 - (0xff < sVar13);
            sVar13 = (short)((unkuint10)auVar171._0_10_ >> 0x40);
            auVar177[4] = (0 < sVar13) * (sVar13 < 0x100) * cVar28 - (0xff < sVar13);
            sVar13 = auVar171._10_2_;
            auVar177[5] = (0 < sVar13) * (sVar13 < 0x100) * cVar29 - (0xff < sVar13);
            sVar13 = auVar172._12_2_;
            auVar177[6] = (0 < sVar13) * (sVar13 < 0x100) * cVar30 - (0xff < sVar13);
            sVar13 = auVar176._14_2_;
            auVar177[7] = (0 < sVar13) * (sVar13 < 0x100) * cVar31 - (0xff < sVar13);
            auVar177[8] = (0 < sVar53) * (sVar53 < 0x100) * cVar18 - (0xff < sVar53);
            sVar13 = (short)((uint)uVar150 >> 0x10);
            auVar177[9] = (0 < sVar13) * (sVar13 < 0x100) * cVar108 - (0xff < sVar13);
            sVar13 = (short)((uint6)uVar151 >> 0x20);
            auVar177[10] = (0 < sVar13) * (sVar13 < 0x100) * cVar19 - (0xff < sVar13);
            sVar13 = (short)((ulong)uVar152 >> 0x30);
            auVar177[0xb] = (0 < sVar13) * (sVar13 < 0x100) * cVar20 - (0xff < sVar13);
            sVar13 = (short)((unkuint10)auVar153._0_10_ >> 0x40);
            auVar177[0xc] = (0 < sVar13) * (sVar13 < 0x100) * cVar21 - (0xff < sVar13);
            sVar13 = auVar153._10_2_;
            auVar177[0xd] = (0 < sVar13) * (sVar13 < 0x100) * cVar22 - (0xff < sVar13);
            sVar13 = auVar154._12_2_;
            auVar177[0xe] = (0 < sVar13) * (sVar13 < 0x100) * cVar23 - (0xff < sVar13);
            sVar13 = auVar156._14_2_;
            auVar177[0xf] = (0 < sVar13) * (sVar13 < 0x100) * cVar109 - (0xff < sVar13);
            *(undefined1 (*) [16])((long)&local_288[0].data + lVar90) = auVar177;
            lVar90 = lVar90 + 0x10;
            uVar60 = uVar60 + 0x10;
            uVar95 = uVar95 + 0x10;
            uVar121 = uVar121 + 0x10;
            uVar123 = uVar123 + 0x10;
            uVar124 = uVar124 + 0x10;
            uVar126 = uVar126 + 0x10;
            uVar127 = uVar127 + 0x10;
            uVar128 = uVar128 + 0x10;
            uVar129 = uVar129 + 0x10;
            uVar130 = uVar130 + 0x10;
            uVar131 = uVar131 + 0x10;
            uVar132 = uVar132 + 0x10;
            uVar133 = uVar133 + 0x10;
            uVar135 = uVar135 + 0x10;
            uVar136 = uVar136 + 0x10;
            uVar137 = uVar137 + 0x10;
          } while (lVar90 != 0x100);
          auVar116 = _DAT_0017a2b0;
          if (0 < psVar80[1].cff.cursor) {
            lVar72._0_4_ = psVar80[1].hmtx;
            lVar72._4_4_ = psVar80[1].kern;
            iVar61 = 0;
            do {
              if ((*(int *)(lVar72 + 0xc) != 0) && (*(ushort *)(lVar72 + 6) != 0)) {
                uVar52 = *(ushort *)(lVar72 + 4);
                iVar92 = atlas->TexWidth;
                puVar66 = atlas->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar72 + 10) * (long)iVar92 +
                          (ulong)*(ushort *)(lVar72 + 8);
                uVar60 = (uint)*(ushort *)(lVar72 + 6);
                do {
                  if ((ulong)uVar52 != 0) {
                    uVar63 = 0;
                    do {
                      puVar66[uVar63] =
                           *(uchar *)((long)&local_288[0].data + (ulong)puVar66[uVar63]);
                      uVar63 = uVar63 + 1;
                    } while (uVar52 != uVar63);
                  }
                  puVar66 = puVar66 + iVar92;
                  bVar97 = 1 < (int)uVar60;
                  uVar60 = uVar60 - 1;
                } while (bVar97);
              }
              iVar61 = iVar61 + 1;
              lVar72 = lVar72 + 0x10;
            } while (iVar61 < psVar80[1].cff.cursor);
          }
        }
        psVar80[1].hmtx = 0;
        psVar80[1].kern = 0;
        lVar90 = local_300;
      }
      lVar90 = lVar90 + 1;
    } while (lVar90 < iVar185);
  }
  ImGui::MemFree(local_418);
  ImGui::MemFree(local_360);
  uVar152 = local_448._8_8_;
  if ((void *)local_448._8_8_ != (void *)0x0) {
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_448._8_8_;
    local_448 = auVar38 << 0x40;
    ImGui::MemFree((void *)uVar152);
    local_448._8_8_ = 0;
  }
  if (0 < iVar185) {
    lVar90 = 0;
    auVar106._0_12_ = DAT_0017d780._0_12_;
    auVar106._12_2_ = DAT_0017d780._6_2_;
    auVar106._14_2_ = DAT_0017d780._6_2_;
    auVar105._12_4_ = auVar106._12_4_;
    auVar105._0_10_ = (unkbyte10)DAT_0017d780;
    auVar105._10_2_ = DAT_0017d780._4_2_;
    auVar104._10_6_ = auVar105._10_6_;
    auVar104._0_8_ = (undefined8)DAT_0017d780;
    auVar104._8_2_ = DAT_0017d780._4_2_;
    local_458._8_8_ = auVar104._8_8_;
    local_458._6_2_ = DAT_0017d780._2_2_;
    local_458._4_2_ = DAT_0017d780._2_2_;
    local_458._0_2_ = (undefined2)DAT_0017d780;
    local_458._2_2_ = local_458._0_2_;
    pvVar62 = __dest;
    do {
      auVar114 = local_478;
      lVar72 = lVar90 * 0x110;
      __dest = pvVar62;
      if (*(int *)((long)pvVar62 + lVar72 + 0xe8) != 0) {
        pIVar16 = (atlas->ConfigData).Data;
        pIVar87 = pIVar16 + lVar90;
        pIVar14 = pIVar16[lVar90].DstFont;
        if (pIVar16[lVar90].MergeMode == false) {
          fVar113 = pIVar16[lVar90].SizePixels;
          lVar96 = *(long *)((long)pvVar62 + lVar72 + 8);
          lVar78 = (long)*(int *)((long)pvVar62 + lVar72 + 0x24);
          local_478._1_3_ = 0;
          local_478[0] = *(byte *)(lVar96 + 4 + lVar78);
          local_478._4_12_ = auVar114._4_12_;
          bVar99 = *(byte *)(lVar96 + 5 + lVar78);
          bVar107 = *(byte *)(lVar96 + 7 + lVar78);
          bVar11 = *(byte *)(lVar96 + 6 + lVar78);
          ImFont::ClearOutputData(pIVar14);
          iVar61 = (uint)bVar11 * 0x100 + local_478._0_4_;
          auVar33._1_9_ = (unkuint9)(byte)((uint)iVar61 >> 0x18) << 8;
          auVar33[0] = (char)((uint)iVar61 >> 0x10);
          auVar33._10_6_ = 0;
          auVar42._1_12_ = SUB1612(auVar33 << 0x28,4);
          auVar42[0] = (char)((uint)iVar61 >> 8);
          auVar42[0xd] = 0;
          auVar45._1_14_ = auVar42 << 8;
          auVar45[0] = (char)iVar61;
          auVar45[0xf] = 0;
          auVar114 = ZEXT416((uint)bVar99 | (uint)bVar107 << 0x10) | auVar45 << 8;
          sVar53 = auVar114._0_2_;
          sVar13 = auVar114._2_2_;
          auVar117._0_4_ = (float)((int)sVar53 - (int)sVar13);
          fVar113 = fVar113 / auVar117._0_4_;
          sVar112 = auVar114._6_2_;
          auVar120._0_14_ = ZEXT414((uint)auVar117._0_4_);
          auVar120._14_2_ = sVar112;
          sVar110 = auVar114._4_2_;
          auVar119._12_4_ = auVar120._12_4_;
          auVar119._4_6_ = 0;
          auVar119._0_4_ = auVar117._0_4_;
          auVar119._10_2_ = sVar110;
          auVar118._10_6_ = auVar119._10_6_;
          auVar118._4_6_ = 0;
          auVar118._0_4_ = auVar117._0_4_;
          auVar117._8_8_ = auVar118._8_8_;
          auVar117._6_2_ = sVar13;
          auVar117._4_2_ = (short)((uint)auVar117._0_4_ >> 0x10);
          auVar125._0_2_ = -(ushort)(sVar53 < (short)local_458._0_2_);
          auVar125._2_2_ = -(ushort)(sVar53 < (short)local_458._2_2_);
          auVar125._4_2_ = -(ushort)(sVar13 < (short)local_458._4_2_);
          auVar125._6_2_ = -(ushort)(sVar13 < (short)local_458._6_2_);
          auVar125._8_2_ = -(ushort)(sVar110 < (short)local_458._8_2_);
          auVar125._10_2_ = -(ushort)(sVar110 < (short)local_458._10_2_);
          auVar125._12_2_ = -(ushort)(sVar112 < (short)local_458._12_2_);
          auVar125._14_2_ = -(ushort)(sVar112 < (short)local_458._14_2_);
          auVar114 = auVar125 & _DAT_0017a290 | ~auVar125 & _DAT_0017a2d0;
          pIVar14->FontSize = pIVar87->SizePixels;
          pIVar14->ConfigData = pIVar87;
          pIVar14->ConfigDataCount = 0;
          pIVar14->ContainerAtlas = atlas;
          pIVar14->Ascent = (float)(int)(fVar113 * (float)(int)sVar53 + auVar114._0_4_);
          pIVar14->Descent =
               (float)(int)(fVar113 * (float)(auVar117._4_4_ >> 0x10) + auVar114._4_4_);
        }
        pIVar14->ConfigDataCount = pIVar14->ConfigDataCount + 1;
        if (0 < *(int *)((long)pvVar62 + lVar72 + 0xe8)) {
          fVar113 = (pIVar87->GlyphOffset).x;
          local_478 = ZEXT416((uint)((float)(int)(pIVar14->Ascent + 0.5) + (pIVar87->GlyphOffset).y)
                             );
          lVar78 = 0;
          lVar96 = 0;
          do {
            lVar17 = *(long *)((long)pvVar62 + lVar72 + 0xd0);
            fVar140 = 1.0 / (float)atlas->TexHeight;
            fVar100 = 1.0 / (float)atlas->TexWidth;
            ImFont::AddGlyph(pIVar14,pIVar87,
                             *(ImWchar *)(*(long *)((long)pvVar62 + lVar72 + 0x108) + lVar96 * 4),
                             *(float *)(lVar17 + 8 + lVar78) + 0.0 + fVar113,
                             *(float *)(lVar17 + 0xc + lVar78) + 0.0 + local_478._0_4_,
                             *(float *)(lVar17 + 0x14 + lVar78) + 0.0 + fVar113,
                             *(float *)(lVar17 + 0x18 + lVar78) + 0.0 + local_478._0_4_,
                             (float)*(ushort *)(lVar17 + lVar78) * fVar100,
                             (float)*(ushort *)(lVar17 + 2 + lVar78) * fVar140,
                             (float)*(ushort *)(lVar17 + 4 + lVar78) * fVar100,
                             (float)*(ushort *)(lVar17 + 6 + lVar78) * fVar140,
                             *(float *)(lVar17 + 0x10 + lVar78));
            lVar96 = lVar96 + 1;
            lVar78 = lVar78 + 0x1c;
          } while (lVar96 < *(int *)((long)pvVar62 + lVar72 + 0xe8));
        }
      }
      lVar90 = lVar90 + 1;
      pvVar62 = __dest;
    } while (lVar90 < iVar185);
    if (0 < iVar185) {
      lVar90 = 0x108;
      lVar72 = 0;
      do {
        __dest = pvVar62;
        if (*(void **)((long)pvVar62 + lVar90) != (void *)0x0) {
          ImGui::MemFree(*(void **)((long)pvVar62 + lVar90));
        }
        pvVar62 = *(void **)((long)pvVar62 + lVar90 + -0x10);
        if (pvVar62 != (void *)0x0) {
          ImGui::MemFree(pvVar62);
        }
        lVar72 = lVar72 + 1;
        lVar90 = lVar90 + 0x110;
        pvVar62 = __dest;
      } while (lVar72 < iVar185);
    }
  }
  if (__dest != (void *)0x0) {
    ImGui::MemFree(__dest);
    __dest = (void *)0x0;
  }
  ImFontAtlasBuildFinish(atlas);
  if (pvStack_420 != (void *)0x0) {
    ImGui::MemFree(pvStack_420);
  }
  if ((void *)local_448._8_8_ != (void *)0x0) {
    ImGui::MemFree((void *)local_448._8_8_);
  }
LAB_00132eb9:
  bVar99 = (byte)((uint)iVar184 >> 0x18);
  if (pvStack_430 != (void *)0x0) {
    ImGui::MemFree(pvStack_430);
  }
  if (__dest != (void *)0x0) {
    ImGui::MemFree(__dest);
  }
  return (bool)(bVar99 & 1);
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}